

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  long lVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  int iVar94;
  undefined4 uVar95;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vint4 bi;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  vfloat4 a0;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vint4 ai_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar172;
  float fVar173;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar174;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  vfloat4 a0_3;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar214;
  float fVar215;
  vfloat4 b0_2;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar216;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  vfloat4 a0_4;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  __m128 a_2;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar252 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  ulong local_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  long local_260;
  ulong local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  uint auStack_178 [4];
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar238 [32];
  
  PVar6 = prim[1];
  uVar24 = (ulong)(byte)PVar6;
  lVar31 = uVar24 * 0x25;
  fVar219 = *(float *)(prim + lVar31 + 0x12);
  auVar43 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar31 + 6));
  auVar53._0_4_ = fVar219 * (ray->dir).field_0.m128[0];
  auVar53._4_4_ = fVar219 * (ray->dir).field_0.m128[1];
  auVar53._8_4_ = fVar219 * (ray->dir).field_0.m128[2];
  auVar53._12_4_ = fVar219 * (ray->dir).field_0.m128[3];
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar124._0_4_ = fVar219 * auVar43._0_4_;
  auVar124._4_4_ = fVar219 * auVar43._4_4_;
  auVar124._8_4_ = fVar219 * auVar43._8_4_;
  auVar124._12_4_ = fVar219 * auVar43._12_4_;
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xf + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar24 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1a + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1b + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1c + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar131._4_4_ = auVar53._0_4_;
  auVar131._0_4_ = auVar53._0_4_;
  auVar131._8_4_ = auVar53._0_4_;
  auVar131._12_4_ = auVar53._0_4_;
  auVar57 = vshufps_avx(auVar53,auVar53,0x55);
  auVar58 = vshufps_avx(auVar53,auVar53,0xaa);
  fVar219 = auVar58._0_4_;
  auVar109._0_4_ = fVar219 * auVar39._0_4_;
  fVar203 = auVar58._4_4_;
  auVar109._4_4_ = fVar203 * auVar39._4_4_;
  fVar214 = auVar58._8_4_;
  auVar109._8_4_ = fVar214 * auVar39._8_4_;
  fVar215 = auVar58._12_4_;
  auVar109._12_4_ = fVar215 * auVar39._12_4_;
  auVar50._0_4_ = auVar40._0_4_ * fVar219;
  auVar50._4_4_ = auVar40._4_4_ * fVar203;
  auVar50._8_4_ = auVar40._8_4_ * fVar214;
  auVar50._12_4_ = auVar40._12_4_ * fVar215;
  auVar45._0_4_ = auVar41._0_4_ * fVar219;
  auVar45._4_4_ = auVar41._4_4_ * fVar203;
  auVar45._8_4_ = auVar41._8_4_ * fVar214;
  auVar45._12_4_ = auVar41._12_4_ * fVar215;
  auVar58 = vfmadd231ps_fma(auVar109,auVar57,auVar43);
  auVar59 = vfmadd231ps_fma(auVar50,auVar57,auVar56);
  auVar57 = vfmadd231ps_fma(auVar45,auVar55,auVar57);
  auVar58 = vfmadd231ps_fma(auVar58,auVar131,auVar42);
  auVar59 = vfmadd231ps_fma(auVar59,auVar131,auVar51);
  auVar61 = vfmadd231ps_fma(auVar57,auVar54,auVar131);
  auVar232._4_4_ = auVar124._0_4_;
  auVar232._0_4_ = auVar124._0_4_;
  auVar232._8_4_ = auVar124._0_4_;
  auVar232._12_4_ = auVar124._0_4_;
  auVar57 = vshufps_avx(auVar124,auVar124,0x55);
  auVar81._16_16_ = in_YmmResult._16_16_;
  auVar38 = vshufps_avx512vl(auVar124,auVar124,0xaa);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar40 = vmulps_avx512vl(auVar38,auVar40);
  auVar41 = vmulps_avx512vl(auVar38,auVar41);
  auVar43 = vfmadd231ps_fma(auVar39,auVar57,auVar43);
  auVar39 = vfmadd231ps_fma(auVar40,auVar57,auVar56);
  auVar56 = vfmadd231ps_fma(auVar41,auVar57,auVar55);
  auVar44 = vfmadd231ps_fma(auVar43,auVar232,auVar42);
  auVar45 = vfmadd231ps_fma(auVar39,auVar232,auVar51);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar42);
  auVar46 = vfmadd231ps_fma(auVar56,auVar232,auVar54);
  auVar43 = vandps_avx512vl(auVar58,auVar42);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar43,auVar164,1);
  bVar30 = (bool)((byte)uVar37 & 1);
  auVar47._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar58._0_4_;
  bVar30 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar58._4_4_;
  bVar30 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar58._8_4_;
  bVar30 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar58._12_4_;
  auVar43 = vandps_avx512vl(auVar59,auVar42);
  uVar37 = vcmpps_avx512vl(auVar43,auVar164,1);
  bVar30 = (bool)((byte)uVar37 & 1);
  auVar48._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar59._0_4_;
  bVar30 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar59._4_4_;
  bVar30 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar59._8_4_;
  bVar30 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar59._12_4_;
  auVar42 = vandps_avx512vl(auVar61,auVar42);
  uVar37 = vcmpps_avx512vl(auVar42,auVar164,1);
  bVar30 = (bool)((byte)uVar37 & 1);
  auVar49._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar61._0_4_;
  bVar30 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar61._4_4_;
  bVar30 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar61._8_4_;
  bVar30 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * auVar61._12_4_;
  auVar42 = vrcp14ps_avx512vl(auVar47);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar250 = ZEXT1664(auVar43);
  auVar39 = vfnmadd213ps_avx512vl(auVar47,auVar42,auVar43);
  auVar61 = vfmadd132ps_fma(auVar39,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar48);
  auVar39 = vfnmadd213ps_avx512vl(auVar48,auVar42,auVar43);
  auVar38 = vfmadd132ps_fma(auVar39,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar49);
  auVar43 = vfnmadd213ps_avx512vl(auVar49,auVar42,auVar43);
  auVar60 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
  fVar219 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar31 + 0x16)) *
            *(float *)(prim + lVar31 + 0x1a);
  auVar147._4_4_ = fVar219;
  auVar147._0_4_ = fVar219;
  auVar147._8_4_ = fVar219;
  auVar147._12_4_ = fVar219;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar42 = vpmovsxwd_avx(auVar42);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar24 * 0xb + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar51 = vsubps_avx(auVar43,auVar42);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar43 = vpmovsxwd_avx(auVar39);
  auVar39 = vfmadd213ps_fma(auVar51,auVar147,auVar42);
  auVar42 = vcvtdq2ps_avx(auVar43);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar24 * 0xd + 6);
  auVar43 = vpmovsxwd_avx(auVar51);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar51 = vfmadd213ps_fma(auVar43,auVar147,auVar42);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar24 * 0x12 + 6);
  auVar42 = vpmovsxwd_avx(auVar56);
  auVar42 = vcvtdq2ps_avx(auVar42);
  uVar37 = (ulong)(uint)((int)(uVar24 * 5) << 2);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar24 * 2 + uVar37 + 6);
  auVar43 = vpmovsxwd_avx(auVar40);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar56 = vfmadd213ps_fma(auVar43,auVar147,auVar42);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar42 = vpmovsxwd_avx(auVar54);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar24 * 0x18 + 6);
  auVar43 = vpmovsxwd_avx(auVar55);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar40 = vfmadd213ps_fma(auVar43,auVar147,auVar42);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar24 * 0x1d + 6);
  auVar42 = vpmovsxwd_avx(auVar41);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar24 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar43 = vpmovsxwd_avx(auVar57);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar54 = vfmadd213ps_fma(auVar43,auVar147,auVar42);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar24) + 6);
  auVar42 = vpmovsxwd_avx(auVar58);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar24 * 0x23 + 6);
  auVar43 = vpmovsxwd_avx(auVar59);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar43 = vfmadd213ps_fma(auVar43,auVar147,auVar42);
  auVar42 = vsubps_avx(auVar39,auVar44);
  auVar148._0_4_ = auVar61._0_4_ * auVar42._0_4_;
  auVar148._4_4_ = auVar61._4_4_ * auVar42._4_4_;
  auVar148._8_4_ = auVar61._8_4_ * auVar42._8_4_;
  auVar148._12_4_ = auVar61._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar51,auVar44);
  auVar110._0_4_ = auVar61._0_4_ * auVar42._0_4_;
  auVar110._4_4_ = auVar61._4_4_ * auVar42._4_4_;
  auVar110._8_4_ = auVar61._8_4_ * auVar42._8_4_;
  auVar110._12_4_ = auVar61._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar56,auVar45);
  auVar132._0_4_ = auVar38._0_4_ * auVar42._0_4_;
  auVar132._4_4_ = auVar38._4_4_ * auVar42._4_4_;
  auVar132._8_4_ = auVar38._8_4_ * auVar42._8_4_;
  auVar132._12_4_ = auVar38._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar40,auVar45);
  auVar52._0_4_ = auVar38._0_4_ * auVar42._0_4_;
  auVar52._4_4_ = auVar38._4_4_ * auVar42._4_4_;
  auVar52._8_4_ = auVar38._8_4_ * auVar42._8_4_;
  auVar52._12_4_ = auVar38._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar54,auVar46);
  auVar125._0_4_ = auVar60._0_4_ * auVar42._0_4_;
  auVar125._4_4_ = auVar60._4_4_ * auVar42._4_4_;
  auVar125._8_4_ = auVar60._8_4_ * auVar42._8_4_;
  auVar125._12_4_ = auVar60._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar43,auVar46);
  auVar46._0_4_ = auVar60._0_4_ * auVar42._0_4_;
  auVar46._4_4_ = auVar60._4_4_ * auVar42._4_4_;
  auVar46._8_4_ = auVar60._8_4_ * auVar42._8_4_;
  auVar46._12_4_ = auVar60._12_4_ * auVar42._12_4_;
  auVar42 = vpminsd_avx(auVar148,auVar110);
  auVar43 = vpminsd_avx(auVar132,auVar52);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar43 = vpminsd_avx(auVar125,auVar46);
  uVar95 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar61._4_4_ = uVar95;
  auVar61._0_4_ = uVar95;
  auVar61._8_4_ = uVar95;
  auVar61._12_4_ = uVar95;
  auVar43 = vmaxps_avx512vl(auVar43,auVar61);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar38._8_4_ = 0x3f7ffffa;
  auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar38._12_4_ = 0x3f7ffffa;
  local_f8 = vmulps_avx512vl(auVar42,auVar38);
  auVar42 = vpmaxsd_avx(auVar148,auVar110);
  auVar43 = vpmaxsd_avx(auVar132,auVar52);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar43 = vpmaxsd_avx(auVar125,auVar46);
  fVar219 = ray->tfar;
  auVar60._4_4_ = fVar219;
  auVar60._0_4_ = fVar219;
  auVar60._8_4_ = fVar219;
  auVar60._12_4_ = fVar219;
  auVar43 = vminps_avx512vl(auVar43,auVar60);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar44._8_4_ = 0x3f800003;
  auVar44._0_8_ = 0x3f8000033f800003;
  auVar44._12_4_ = 0x3f800003;
  auVar42 = vmulps_avx512vl(auVar42,auVar44);
  auVar43 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_f8,auVar42,2);
  uVar37 = vpcmpgtd_avx512vl(auVar43,_DAT_01f7fcf0);
  uVar37 = ((byte)uVar13 & 0xf) & uVar37;
  if ((char)uVar37 == '\0') {
    bVar30 = false;
  }
  else {
    auVar42 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar252 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar246 = ZEXT1664(auVar42);
    local_250 = prim;
    do {
      lVar31 = 0;
      for (uVar24 = uVar37; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      local_2f0 = (ulong)*(uint *)(local_250 + 2);
      pGVar7 = (context->scene->geometries).items[local_2f0].ptr;
      fVar219 = (pGVar7->time_range).lower;
      fVar214 = pGVar7->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar219) / ((pGVar7->time_range).upper - fVar219));
      auVar42 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
      local_258 = (ulong)*(uint *)(local_250 + lVar31 * 4 + 6);
      auVar43 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar42 = vminss_avx(auVar42,auVar43);
      auVar44 = vmaxss_avx512f(auVar252._0_16_,auVar42);
      uVar24 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               local_258 *
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar29 = (long)(int)auVar44._0_4_ * 0x38;
      lVar9 = *(long *)(_Var8 + lVar29);
      lVar10 = *(long *)(_Var8 + 0x10 + lVar29);
      auVar42 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar24);
      lVar31 = uVar24 + 1;
      auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar31);
      lVar26 = uVar24 + 2;
      auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar26);
      lVar1 = uVar24 + 3;
      auVar51 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
      lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
      lVar10 = *(long *)(lVar9 + lVar29);
      lVar11 = *(long *)(lVar9 + 0x10 + lVar29);
      auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
      auVar40 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
      auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar26);
      auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      lVar10 = *(long *)(_Var8 + 0x38 + lVar29);
      lVar11 = *(long *)(_Var8 + 0x48 + lVar29);
      auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
      auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
      auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar26);
      auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      lVar10 = *(long *)(lVar9 + 0x38 + lVar29);
      lVar9 = *(long *)(lVar9 + 0x48 + lVar29);
      auVar61 = *(undefined1 (*) [16])(lVar10 + uVar24 * lVar9);
      auVar38 = *(undefined1 (*) [16])(lVar10 + lVar31 * lVar9);
      auVar60 = *(undefined1 (*) [16])(lVar10 + lVar26 * lVar9);
      fVar214 = fVar214 - auVar44._0_4_;
      auVar77._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      auVar44 = vmulps_avx512vl(auVar51,auVar77._0_16_);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
      auVar46 = vfmadd213ps_avx512vl(auVar45,auVar39,auVar44);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar47);
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar42,auVar45);
      auVar109 = auVar246._0_16_;
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar109);
      auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar43,auVar77._0_16_);
      auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar42,auVar109);
      auVar48 = vmulps_avx512vl(auVar55,auVar77._0_16_);
      auVar49 = vfmadd213ps_avx512vl(auVar45,auVar54,auVar48);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar40,auVar47);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar56,auVar45);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar54,auVar109);
      auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar40,auVar77._0_16_);
      auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar56,auVar109);
      auVar50 = vmulps_avx512vl(auVar51,auVar45);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar47);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar45);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar42,auVar77._0_16_);
      auVar51 = vmulps_avx512vl(auVar51,auVar109);
      auVar39 = vfmadd231ps_avx512vl(auVar51,auVar77._0_16_,auVar39);
      auVar43 = vfnmadd231ps_avx512vl(auVar39,auVar109,auVar43);
      auVar52 = vfnmadd231ps_avx512vl(auVar43,auVar77._0_16_,auVar42);
      auVar42 = vmulps_avx512vl(auVar55,auVar45);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar54,auVar47);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar45);
      auVar53 = vfmadd231ps_avx512vl(auVar42,auVar56,auVar77._0_16_);
      auVar42 = vmulps_avx512vl(auVar55,auVar109);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar77._0_16_,auVar54);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar109,auVar40);
      auVar40 = vfnmadd231ps_avx512vl(auVar42,auVar77._0_16_,auVar56);
      auVar43 = vshufps_avx512vl(auVar44,auVar44,0xc9);
      auVar42 = vshufps_avx512vl(auVar49,auVar49,0xc9);
      auVar42 = vmulps_avx512vl(auVar44,auVar42);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar43,auVar49);
      auVar39 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar42 = vmulps_avx512vl(auVar44,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar48);
      auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar149._0_4_ = auVar52._0_4_ * auVar43._0_4_;
      auVar149._4_4_ = auVar52._4_4_ * auVar43._4_4_;
      auVar149._8_4_ = auVar52._8_4_ * auVar43._8_4_;
      auVar149._12_4_ = auVar52._12_4_ * auVar43._12_4_;
      auVar43 = vfmsub231ps_fma(auVar149,auVar42,auVar53);
      auVar56 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar150._0_4_ = auVar52._0_4_ * auVar43._0_4_;
      auVar150._4_4_ = auVar52._4_4_ * auVar43._4_4_;
      auVar150._8_4_ = auVar52._8_4_ * auVar43._8_4_;
      auVar150._12_4_ = auVar52._12_4_ * auVar43._12_4_;
      auVar42 = vfmsub231ps_fma(auVar150,auVar42,auVar40);
      auVar40 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vdpps_avx(auVar39,auVar39,0x7f);
      auVar77._16_16_ = auVar81._16_16_;
      auVar62._4_28_ = auVar77._4_28_;
      auVar62._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar62._0_16_);
      fVar219 = auVar43._0_4_;
      auVar54 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar43 = vmulss_avx512f(auVar54,auVar43);
      auVar43 = vmulss_avx512f(auVar43,ZEXT416((uint)(fVar219 * fVar219)));
      fVar219 = fVar219 * 1.5 + auVar43._0_4_;
      auVar175._4_4_ = fVar219;
      auVar175._0_4_ = fVar219;
      auVar175._8_4_ = fVar219;
      auVar175._12_4_ = fVar219;
      auVar43 = vdpps_avx(auVar39,auVar51,0x7f);
      auVar54 = vmulps_avx512vl(auVar39,auVar175);
      auVar55 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar55,auVar51);
      fVar203 = auVar43._0_4_;
      auVar133._0_4_ = fVar203 * auVar39._0_4_;
      auVar133._4_4_ = fVar203 * auVar39._4_4_;
      auVar133._8_4_ = fVar203 * auVar39._8_4_;
      auVar133._12_4_ = fVar203 * auVar39._12_4_;
      auVar39 = vsubps_avx(auVar51,auVar133);
      auVar43 = vrcp14ss_avx512f(auVar77._0_16_,auVar62._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
      fVar215 = auVar43._0_4_ * auVar42._0_4_;
      auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
      auVar80._16_16_ = auVar81._16_16_;
      auVar80._0_16_ = auVar77._0_16_;
      auVar63._4_28_ = auVar80._4_28_;
      auVar63._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar63._0_16_);
      fVar203 = auVar43._0_4_;
      auVar43 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      fVar203 = fVar203 * 1.5 + auVar43._0_4_ * fVar203 * fVar203 * fVar203;
      auVar176._0_4_ = auVar56._0_4_ * fVar203;
      auVar176._4_4_ = auVar56._4_4_ * fVar203;
      auVar176._8_4_ = auVar56._8_4_ * fVar203;
      auVar176._12_4_ = auVar56._12_4_ * fVar203;
      auVar43 = vdpps_avx(auVar56,auVar40,0x7f);
      auVar51 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar51,auVar40);
      fVar216 = auVar43._0_4_;
      auVar104._0_4_ = fVar216 * auVar56._0_4_;
      auVar104._4_4_ = fVar216 * auVar56._4_4_;
      auVar104._8_4_ = fVar216 * auVar56._8_4_;
      auVar104._12_4_ = fVar216 * auVar56._12_4_;
      auVar43 = vsubps_avx(auVar51,auVar104);
      auVar51 = vrcp14ss_avx512f(auVar77._0_16_,auVar63._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar51,ZEXT416(0x40000000));
      fVar216 = auVar51._0_4_ * auVar42._0_4_;
      auVar42 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar51 = vmulps_avx512vl(auVar42,auVar54);
      auVar48 = vsubps_avx512vl(auVar46,auVar51);
      auVar56 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar56 = vmulps_avx512vl(auVar56,auVar54);
      auVar126._0_4_ = auVar56._0_4_ + auVar42._0_4_ * fVar219 * fVar215 * auVar39._0_4_;
      auVar126._4_4_ = auVar56._4_4_ + auVar42._4_4_ * fVar219 * fVar215 * auVar39._4_4_;
      auVar126._8_4_ = auVar56._8_4_ + auVar42._8_4_ * fVar219 * fVar215 * auVar39._8_4_;
      auVar126._12_4_ = auVar56._12_4_ + auVar42._12_4_ * fVar219 * fVar215 * auVar39._12_4_;
      auVar39 = vsubps_avx512vl(auVar44,auVar126);
      auVar46 = vaddps_avx512vl(auVar46,auVar51);
      auVar51 = vaddps_avx512vl(auVar44,auVar126);
      auVar42 = vshufps_avx512vl(auVar50,auVar50,0xff);
      auVar56 = vmulps_avx512vl(auVar42,auVar176);
      auVar44 = vsubps_avx512vl(auVar50,auVar56);
      auVar40 = vshufps_avx512vl(auVar52,auVar52,0xff);
      auVar40 = vmulps_avx512vl(auVar40,auVar176);
      auVar177._0_4_ = auVar40._0_4_ + auVar42._0_4_ * fVar203 * auVar43._0_4_ * fVar216;
      auVar177._4_4_ = auVar40._4_4_ + auVar42._4_4_ * fVar203 * auVar43._4_4_ * fVar216;
      auVar177._8_4_ = auVar40._8_4_ + auVar42._8_4_ * fVar203 * auVar43._8_4_ * fVar216;
      auVar177._12_4_ = auVar40._12_4_ + auVar42._12_4_ * fVar203 * auVar43._12_4_ * fVar216;
      auVar42 = vsubps_avx(auVar52,auVar177);
      auVar49 = vaddps_avx512vl(auVar50,auVar56);
      auVar43 = vaddps_avx512vl(auVar52,auVar177);
      auVar96._8_4_ = 0x3eaaaaab;
      auVar96._0_8_ = 0x3eaaaaab3eaaaaab;
      auVar96._12_4_ = 0x3eaaaaab;
      auVar165._0_4_ = auVar48._0_4_ + auVar39._0_4_ * 0.33333334;
      auVar165._4_4_ = auVar48._4_4_ + auVar39._4_4_ * 0.33333334;
      auVar165._8_4_ = auVar48._8_4_ + auVar39._8_4_ * 0.33333334;
      auVar165._12_4_ = auVar48._12_4_ + auVar39._12_4_ * 0.33333334;
      auVar151._0_4_ = auVar42._0_4_ * 0.33333334;
      auVar151._4_4_ = auVar42._4_4_ * 0.33333334;
      auVar151._8_4_ = auVar42._8_4_ * 0.33333334;
      auVar151._12_4_ = auVar42._12_4_ * 0.33333334;
      auVar54 = vsubps_avx(auVar44,auVar151);
      local_318._4_4_ = auVar46._4_4_ + auVar51._4_4_ * 0.33333334;
      local_318._0_4_ = auVar46._0_4_ + auVar51._0_4_ * 0.33333334;
      fStack_310 = auVar46._8_4_ + auVar51._8_4_ * 0.33333334;
      fStack_30c = auVar46._12_4_ + auVar51._12_4_ * 0.33333334;
      auVar42 = vmulps_avx512vl(auVar43,auVar96);
      auVar55 = vsubps_avx(auVar49,auVar42);
      auVar42 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
      auVar43 = vmulps_avx512vl(auVar59,auVar77._0_16_);
      auVar39 = vfmadd213ps_avx512vl(auVar45,auVar58,auVar43);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar57,auVar47);
      auVar50 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar45);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar58,auVar109);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar57,auVar77._0_16_);
      auVar52 = vfnmadd231ps_avx512vl(auVar43,auVar41,auVar109);
      auVar43 = vmulps_avx512vl(auVar42,auVar77._0_16_);
      auVar39 = vfmadd213ps_avx512vl(auVar45,auVar60,auVar43);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar38,auVar47);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar61,auVar45);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar109);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar38,auVar77._0_16_);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar61,auVar109);
      auVar51 = vmulps_avx512vl(auVar59,auVar45);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar47);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar57,auVar45);
      auVar53 = vfmadd231ps_avx512vl(auVar51,auVar41,auVar77._0_16_);
      auVar51 = vmulps_avx512vl(auVar59,auVar109);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar77._0_16_,auVar58);
      auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar109,auVar57);
      auVar41 = vfnmadd231ps_avx512vl(auVar51,auVar77._0_16_,auVar41);
      auVar51 = vmulps_avx512vl(auVar42,auVar45);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar60,auVar47);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar38,auVar45);
      auVar56 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar77._0_16_);
      auVar42 = vmulps_avx512vl(auVar42,auVar109);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar77._0_16_,auVar60);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar109,auVar38);
      auVar251 = ZEXT464(0x3f800000);
      auVar40 = vfnmadd231ps_avx512vl(auVar42,auVar77._0_16_,auVar61);
      auVar42 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar51 = vshufps_avx512vl(auVar39,auVar39,0xc9);
      fVar215 = auVar52._0_4_;
      auVar226._0_4_ = fVar215 * auVar51._0_4_;
      fVar216 = auVar52._4_4_;
      auVar226._4_4_ = fVar216 * auVar51._4_4_;
      fVar217 = auVar52._8_4_;
      auVar226._8_4_ = fVar217 * auVar51._8_4_;
      fVar218 = auVar52._12_4_;
      auVar226._12_4_ = fVar218 * auVar51._12_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar226,auVar42,auVar39);
      auVar39 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar51 = vshufps_avx512vl(auVar43,auVar43,0xc9);
      auVar233._0_4_ = fVar215 * auVar51._0_4_;
      auVar233._4_4_ = fVar216 * auVar51._4_4_;
      auVar233._8_4_ = fVar217 * auVar51._8_4_;
      auVar233._12_4_ = fVar218 * auVar51._12_4_;
      auVar42 = vfmsub231ps_avx512vl(auVar233,auVar42,auVar43);
      auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar43 = vshufps_avx512vl(auVar41,auVar41,0xc9);
      auVar42 = vshufps_avx(auVar56,auVar56,0xc9);
      auVar42 = vmulps_avx512vl(auVar41,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar56);
      auVar56 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar42 = vmulps_avx512vl(auVar41,auVar42);
      auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar40);
      auVar40 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vdpps_avx(auVar39,auVar39,0x7f);
      auVar65._16_16_ = auVar81._16_16_;
      auVar65._0_16_ = auVar77._0_16_;
      auVar64._4_28_ = auVar65._4_28_;
      auVar64._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar64._0_16_);
      auVar57 = vmulss_avx512f(auVar43,SUB6416(ZEXT464(0x3fc00000),0));
      auVar58 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar58 = vmulss_avx512f(auVar58,auVar43);
      auVar43 = vmulss_avx512f(auVar43,auVar43);
      auVar43 = vmulss_avx512f(auVar58,auVar43);
      auVar43 = vaddss_avx512f(auVar57,auVar43);
      auVar57 = vbroadcastss_avx512vl(auVar43);
      auVar58 = vmulps_avx512vl(auVar39,auVar57);
      auVar43 = vdpps_avx(auVar39,auVar51,0x7f);
      auVar59 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar59,auVar51);
      fVar219 = auVar43._0_4_;
      auVar134._0_4_ = auVar39._0_4_ * fVar219;
      auVar134._4_4_ = auVar39._4_4_ * fVar219;
      auVar134._8_4_ = auVar39._8_4_ * fVar219;
      auVar134._12_4_ = auVar39._12_4_ * fVar219;
      auVar43 = vsubps_avx(auVar51,auVar134);
      auVar39 = vrcp14ss_avx512f(auVar77._0_16_,auVar64._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar39,ZEXT416(0x40000000));
      fVar219 = auVar39._0_4_ * auVar42._0_4_;
      auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
      auVar135._0_4_ = fVar219 * auVar43._0_4_;
      auVar135._4_4_ = fVar219 * auVar43._4_4_;
      auVar135._8_4_ = fVar219 * auVar43._8_4_;
      auVar135._12_4_ = fVar219 * auVar43._12_4_;
      auVar39 = vmulps_avx512vl(auVar57,auVar135);
      auVar67._16_16_ = auVar81._16_16_;
      auVar67._0_16_ = auVar77._0_16_;
      auVar66._4_28_ = auVar67._4_28_;
      auVar66._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar66._0_16_);
      fVar219 = auVar43._0_4_;
      auVar51 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar43 = vmulss_avx512f(auVar51,auVar43);
      auVar43 = vmulss_avx512f(auVar43,ZEXT416((uint)(fVar219 * fVar219)));
      fVar219 = fVar219 * 1.5 + auVar43._0_4_;
      auVar239._0_4_ = auVar56._0_4_ * fVar219;
      auVar239._4_4_ = auVar56._4_4_ * fVar219;
      auVar239._8_4_ = auVar56._8_4_ * fVar219;
      auVar239._12_4_ = auVar56._12_4_ * fVar219;
      auVar43 = vdpps_avx(auVar56,auVar40,0x7f);
      auVar51 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar51,auVar40);
      fVar203 = auVar43._0_4_;
      auVar152._0_4_ = auVar56._0_4_ * fVar203;
      auVar152._4_4_ = auVar56._4_4_ * fVar203;
      auVar152._8_4_ = auVar56._8_4_ * fVar203;
      auVar152._12_4_ = auVar56._12_4_ * fVar203;
      auVar43 = vsubps_avx(auVar51,auVar152);
      auVar51 = vrcp14ss_avx512f(auVar77._0_16_,auVar66._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar51,ZEXT416(0x40000000));
      fVar203 = auVar51._0_4_ * auVar42._0_4_;
      auVar51 = vshufps_avx512vl(auVar50,auVar50,0xff);
      auVar56 = vmulps_avx512vl(auVar51,auVar58);
      auVar40 = vsubps_avx512vl(auVar50,auVar56);
      auVar42 = vshufps_avx(auVar52,auVar52,0xff);
      auVar42 = vmulps_avx512vl(auVar42,auVar58);
      auVar136._0_4_ = auVar42._0_4_ + auVar51._0_4_ * auVar39._0_4_;
      auVar136._4_4_ = auVar42._4_4_ + auVar51._4_4_ * auVar39._4_4_;
      auVar136._8_4_ = auVar42._8_4_ + auVar51._8_4_ * auVar39._8_4_;
      auVar136._12_4_ = auVar42._12_4_ + auVar51._12_4_ * auVar39._12_4_;
      auVar42 = vsubps_avx(auVar52,auVar136);
      auVar39 = vaddps_avx512vl(auVar50,auVar56);
      auVar51 = vshufps_avx512vl(auVar53,auVar53,0xff);
      auVar227._0_4_ = auVar51._0_4_ * auVar239._0_4_;
      auVar227._4_4_ = auVar51._4_4_ * auVar239._4_4_;
      auVar227._8_4_ = auVar51._8_4_ * auVar239._8_4_;
      auVar227._12_4_ = auVar51._12_4_ * auVar239._12_4_;
      auVar56 = vsubps_avx512vl(auVar53,auVar227);
      auVar57 = vshufps_avx512vl(auVar41,auVar41,0xff);
      auVar57 = vmulps_avx512vl(auVar57,auVar239);
      auVar153._0_4_ = auVar57._0_4_ + auVar51._0_4_ * fVar219 * fVar203 * auVar43._0_4_;
      auVar153._4_4_ = auVar57._4_4_ + auVar51._4_4_ * fVar219 * fVar203 * auVar43._4_4_;
      auVar153._8_4_ = auVar57._8_4_ + auVar51._8_4_ * fVar219 * fVar203 * auVar43._8_4_;
      auVar153._12_4_ = auVar57._12_4_ + auVar51._12_4_ * fVar219 * fVar203 * auVar43._12_4_;
      auVar43 = vsubps_avx512vl(auVar41,auVar153);
      auVar51 = vaddps_avx512vl(auVar53,auVar227);
      auVar41 = vaddps_avx512vl(auVar41,auVar153);
      auVar196._0_4_ = auVar40._0_4_ + auVar42._0_4_ * 0.33333334;
      auVar196._4_4_ = auVar40._4_4_ + auVar42._4_4_ * 0.33333334;
      auVar196._8_4_ = auVar40._8_4_ + auVar42._8_4_ * 0.33333334;
      auVar196._12_4_ = auVar40._12_4_ + auVar42._12_4_ * 0.33333334;
      auVar184._0_4_ = auVar43._0_4_ * 0.33333334;
      auVar184._4_4_ = auVar43._4_4_ * 0.33333334;
      auVar184._8_4_ = auVar43._8_4_ * 0.33333334;
      auVar184._12_4_ = auVar43._12_4_ * 0.33333334;
      auVar42 = vsubps_avx(auVar56,auVar184);
      auVar137._0_4_ = auVar39._0_4_ + (fVar215 + auVar136._0_4_) * 0.33333334;
      auVar137._4_4_ = auVar39._4_4_ + (fVar216 + auVar136._4_4_) * 0.33333334;
      auVar137._8_4_ = auVar39._8_4_ + (fVar217 + auVar136._8_4_) * 0.33333334;
      auVar137._12_4_ = auVar39._12_4_ + (fVar218 + auVar136._12_4_) * 0.33333334;
      auVar154._0_4_ = auVar41._0_4_ * 0.33333334;
      auVar154._4_4_ = auVar41._4_4_ * 0.33333334;
      auVar154._8_4_ = auVar41._8_4_ * 0.33333334;
      auVar154._12_4_ = auVar41._12_4_ * 0.33333334;
      auVar43 = vsubps_avx(auVar51,auVar154);
      auVar240._4_4_ = fVar214;
      auVar240._0_4_ = fVar214;
      auVar240._8_4_ = fVar214;
      auVar240._12_4_ = fVar214;
      auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar214));
      auVar97._0_4_ = auVar41._0_4_;
      auVar97._4_4_ = auVar97._0_4_;
      auVar97._8_4_ = auVar97._0_4_;
      auVar97._12_4_ = auVar97._0_4_;
      auVar40 = vmulps_avx512vl(auVar240,auVar40);
      auVar41 = vmulps_avx512vl(auVar240,auVar196);
      auVar42 = vmulps_avx512vl(auVar240,auVar42);
      auVar234._0_4_ = fVar214 * auVar56._0_4_;
      auVar234._4_4_ = fVar214 * auVar56._4_4_;
      auVar234._8_4_ = fVar214 * auVar56._8_4_;
      auVar234._12_4_ = fVar214 * auVar56._12_4_;
      local_1a8 = vfmadd231ps_avx512vl(auVar40,auVar97,auVar48);
      local_1b8 = vfmadd231ps_avx512vl(auVar41,auVar97,auVar165);
      local_1c8 = vfmadd231ps_avx512vl(auVar42,auVar97,auVar54);
      local_1d8 = vfmadd231ps_fma(auVar234,auVar97,auVar44);
      auVar42 = vmulps_avx512vl(auVar240,auVar39);
      auVar39 = vmulps_avx512vl(auVar240,auVar137);
      auVar43 = vmulps_avx512vl(auVar240,auVar43);
      auVar228._0_4_ = fVar214 * auVar51._0_4_;
      auVar228._4_4_ = fVar214 * auVar51._4_4_;
      auVar228._8_4_ = fVar214 * auVar51._8_4_;
      auVar228._12_4_ = fVar214 * auVar51._12_4_;
      _local_1e8 = vfmadd231ps_avx512vl(auVar42,auVar97,auVar46);
      _local_1f8 = vfmadd231ps_avx512vl(auVar39,auVar97,_local_318);
      _local_208 = vfmadd231ps_avx512vl(auVar43,auVar97,auVar55);
      _local_218 = vfmadd231ps_fma(auVar228,auVar97,auVar49);
      aVar3 = (ray->org).field_0;
      auVar43 = vsubps_avx512vl(local_1a8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar105._4_4_ = uVar95;
      auVar105._0_4_ = uVar95;
      auVar105._8_4_ = uVar95;
      auVar105._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      fVar219 = (pre->ray_space).vz.field_0.m128[0];
      fVar203 = (pre->ray_space).vz.field_0.m128[1];
      fVar214 = (pre->ray_space).vz.field_0.m128[2];
      fVar215 = (pre->ray_space).vz.field_0.m128[3];
      auVar98._0_4_ = fVar219 * auVar43._0_4_;
      auVar98._4_4_ = fVar203 * auVar43._4_4_;
      auVar98._8_4_ = fVar214 * auVar43._8_4_;
      auVar98._12_4_ = fVar215 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar5,auVar42);
      auVar40 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar105);
      auVar43 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar111._4_4_ = uVar95;
      auVar111._0_4_ = uVar95;
      auVar111._8_4_ = uVar95;
      auVar111._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar106._0_4_ = fVar219 * auVar43._0_4_;
      auVar106._4_4_ = fVar203 * auVar43._4_4_;
      auVar106._8_4_ = fVar214 * auVar43._8_4_;
      auVar106._12_4_ = fVar215 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar42);
      auVar54 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar111);
      auVar43 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar155._4_4_ = uVar95;
      auVar155._0_4_ = uVar95;
      auVar155._8_4_ = uVar95;
      auVar155._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar112._0_4_ = fVar219 * auVar43._0_4_;
      auVar112._4_4_ = fVar203 * auVar43._4_4_;
      auVar112._8_4_ = fVar214 * auVar43._8_4_;
      auVar112._12_4_ = fVar215 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar5,auVar42);
      auVar55 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar155);
      auVar43 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar178._4_4_ = uVar95;
      auVar178._0_4_ = uVar95;
      auVar178._8_4_ = uVar95;
      auVar178._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar156._0_4_ = fVar219 * auVar43._0_4_;
      auVar156._4_4_ = fVar203 * auVar43._4_4_;
      auVar156._8_4_ = fVar214 * auVar43._8_4_;
      auVar156._12_4_ = fVar215 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar5,auVar42);
      auVar41 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar178);
      auVar43 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar185._4_4_ = uVar95;
      auVar185._0_4_ = uVar95;
      auVar185._8_4_ = uVar95;
      auVar185._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar179._0_4_ = auVar43._0_4_ * fVar219;
      auVar179._4_4_ = auVar43._4_4_ * fVar203;
      auVar179._8_4_ = auVar43._8_4_ * fVar214;
      auVar179._12_4_ = auVar43._12_4_ * fVar215;
      auVar42 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar42);
      auVar57 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar185);
      auVar43 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar197._4_4_ = uVar95;
      auVar197._0_4_ = uVar95;
      auVar197._8_4_ = uVar95;
      auVar197._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar186._0_4_ = auVar43._0_4_ * fVar219;
      auVar186._4_4_ = auVar43._4_4_ * fVar203;
      auVar186._8_4_ = auVar43._8_4_ * fVar214;
      auVar186._12_4_ = auVar43._12_4_ * fVar215;
      auVar42 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar42);
      auVar58 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar197);
      auVar43 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar204._4_4_ = uVar95;
      auVar204._0_4_ = uVar95;
      auVar204._8_4_ = uVar95;
      auVar204._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar198._0_4_ = auVar43._0_4_ * fVar219;
      auVar198._4_4_ = auVar43._4_4_ * fVar203;
      auVar198._8_4_ = auVar43._8_4_ * fVar214;
      auVar198._12_4_ = auVar43._12_4_ * fVar215;
      auVar42 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar42);
      auVar59 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar204);
      auVar43 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
      uVar95 = auVar43._0_4_;
      auVar205._4_4_ = uVar95;
      auVar205._0_4_ = uVar95;
      auVar205._8_4_ = uVar95;
      auVar205._12_4_ = uVar95;
      auVar42 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar127._0_4_ = fVar219 * auVar43._0_4_;
      auVar127._4_4_ = fVar203 * auVar43._4_4_;
      auVar127._8_4_ = fVar214 * auVar43._8_4_;
      auVar127._12_4_ = fVar215 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar5,auVar42);
      auVar61 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar205);
      auVar39 = vmovlhps_avx(auVar40,auVar57);
      local_308 = vmovlhps_avx(auVar54,auVar58);
      _local_318 = vmovlhps_avx512f(auVar55,auVar59);
      _local_188 = vmovlhps_avx512f(auVar41,auVar61);
      auVar43 = vminps_avx(auVar39,local_308);
      auVar42 = vmaxps_avx(auVar39,local_308);
      auVar51 = vminps_avx512vl(_local_318,_local_188);
      auVar43 = vminps_avx(auVar43,auVar51);
      auVar51 = vmaxps_avx512vl(_local_318,_local_188);
      auVar42 = vmaxps_avx(auVar42,auVar51);
      auVar51 = vshufpd_avx(auVar43,auVar43,3);
      auVar56 = vshufpd_avx(auVar42,auVar42,3);
      auVar43 = vminps_avx(auVar43,auVar51);
      auVar42 = vmaxps_avx(auVar42,auVar56);
      auVar43 = vandps_avx512vl(auVar43,auVar249._0_16_);
      auVar42 = vandps_avx512vl(auVar42,auVar249._0_16_);
      auVar42 = vmaxps_avx(auVar43,auVar42);
      auVar43 = vmovshdup_avx(auVar42);
      auVar42 = vmaxss_avx(auVar43,auVar42);
      lVar31 = uVar37 + 0xf;
      fVar219 = auVar42._0_4_ * 9.536743e-07;
      local_278._8_8_ = auVar40._0_8_;
      local_278._0_8_ = auVar40._0_8_;
      local_288._8_8_ = auVar54._0_8_;
      local_288._0_8_ = auVar54._0_8_;
      local_298 = vmovddup_avx512vl(auVar55);
      local_2a8 = vmovddup_avx512vl(auVar41);
      register0x00001348 = auVar57._0_8_;
      local_2b8 = auVar57._0_8_;
      register0x00001388 = auVar58._0_8_;
      local_2c8 = auVar58._0_8_;
      register0x00001408 = auVar59._0_8_;
      local_2d8 = auVar59._0_8_;
      register0x00001448 = auVar61._0_8_;
      local_2e8 = auVar61._0_8_;
      local_198 = ZEXT416((uint)fVar219);
      auVar99._4_4_ = fVar219;
      auVar99._0_4_ = fVar219;
      auVar99._8_4_ = fVar219;
      auVar99._12_4_ = fVar219;
      local_78._16_4_ = fVar219;
      local_78._0_16_ = auVar99;
      local_78._20_4_ = fVar219;
      local_78._24_4_ = fVar219;
      local_78._28_4_ = fVar219;
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(auVar99,auVar15);
      local_98 = auVar42._0_4_;
      uStack_94 = local_98;
      uStack_90 = local_98;
      uStack_8c = local_98;
      uStack_88 = local_98;
      uStack_84 = local_98;
      uStack_80 = local_98;
      uStack_7c = local_98;
      local_c8 = vsubps_avx(local_308,auVar39);
      local_d8 = vsubps_avx512vl(_local_318,local_308);
      local_e8 = vsubps_avx512vl(_local_188,_local_318);
      local_108 = vsubps_avx512vl(_local_1e8,local_1a8);
      local_118 = vsubps_avx512vl(_local_1f8,local_1b8);
      local_128 = vsubps_avx512vl(_local_208,local_1c8);
      _local_138 = vsubps_avx(_local_218,local_1d8);
      bVar30 = false;
      auVar42 = ZEXT816(0x3f80000000000000);
      uVar24 = 0;
      auVar107 = auVar42;
LAB_01bc2813:
      auVar43 = vshufps_avx(auVar107,auVar107,0x50);
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._0_16_ = auVar235;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar235,auVar43);
      fVar219 = auVar43._0_4_;
      auVar128._0_4_ = local_2b8._0_4_ * fVar219;
      fVar203 = auVar43._4_4_;
      auVar128._4_4_ = local_2b8._4_4_ * fVar203;
      fVar214 = auVar43._8_4_;
      auVar128._8_4_ = local_2b8._8_4_ * fVar214;
      fVar215 = auVar43._12_4_;
      auVar128._12_4_ = local_2b8._12_4_ * fVar215;
      auVar138._0_4_ = local_2c8._0_4_ * fVar219;
      auVar138._4_4_ = local_2c8._4_4_ * fVar203;
      auVar138._8_4_ = local_2c8._8_4_ * fVar214;
      auVar138._12_4_ = local_2c8._12_4_ * fVar215;
      auVar157._0_4_ = local_2d8._0_4_ * fVar219;
      auVar157._4_4_ = local_2d8._4_4_ * fVar203;
      auVar157._8_4_ = local_2d8._8_4_ * fVar214;
      auVar157._12_4_ = local_2d8._12_4_ * fVar215;
      auVar113._0_4_ = local_2e8._0_4_ * fVar219;
      auVar113._4_4_ = local_2e8._4_4_ * fVar203;
      auVar113._8_4_ = local_2e8._8_4_ * fVar214;
      auVar113._12_4_ = local_2e8._12_4_ * fVar215;
      auVar56 = vfmadd231ps_fma(auVar128,auVar51,local_278);
      auVar40 = vfmadd231ps_fma(auVar138,auVar51,local_288);
      auVar54 = vfmadd231ps_avx512vl(auVar157,auVar51,local_298);
      auVar51 = vfmadd231ps_avx512vl(auVar113,local_2a8,auVar51);
      auVar43 = vmovshdup_avx(auVar42);
      fVar203 = auVar42._0_4_;
      fVar219 = (auVar43._0_4_ - fVar203) * 0.04761905;
      auVar144._4_4_ = fVar203;
      auVar144._0_4_ = fVar203;
      auVar144._8_4_ = fVar203;
      auVar144._12_4_ = fVar203;
      auVar144._16_4_ = fVar203;
      auVar144._20_4_ = fVar203;
      auVar144._24_4_ = fVar203;
      auVar144._28_4_ = fVar203;
      auVar72._0_8_ = auVar43._0_8_;
      auVar72._8_8_ = auVar72._0_8_;
      auVar72._16_8_ = auVar72._0_8_;
      auVar72._24_8_ = auVar72._0_8_;
      auVar81 = vsubps_avx(auVar72,auVar144);
      uVar95 = auVar56._0_4_;
      auVar123._4_4_ = uVar95;
      auVar123._0_4_ = uVar95;
      auVar123._8_4_ = uVar95;
      auVar123._12_4_ = uVar95;
      auVar123._16_4_ = uVar95;
      auVar123._20_4_ = uVar95;
      auVar123._24_4_ = uVar95;
      auVar123._28_4_ = uVar95;
      auVar73._8_4_ = 1;
      auVar73._0_8_ = 0x100000001;
      auVar73._12_4_ = 1;
      auVar73._16_4_ = 1;
      auVar73._20_4_ = 1;
      auVar73._24_4_ = 1;
      auVar73._28_4_ = 1;
      auVar80 = ZEXT1632(auVar56);
      auVar77 = vpermps_avx2(auVar73,auVar80);
      auVar62 = vbroadcastss_avx512vl(auVar40);
      auVar78 = ZEXT1632(auVar40);
      auVar63 = vpermps_avx512vl(auVar73,auVar78);
      auVar64 = vbroadcastss_avx512vl(auVar54);
      auVar79 = ZEXT1632(auVar54);
      auVar65 = vpermps_avx512vl(auVar73,auVar79);
      auVar66 = vbroadcastss_avx512vl(auVar51);
      auVar76 = ZEXT1632(auVar51);
      auVar67 = vpermps_avx512vl(auVar73,auVar76);
      auVar201._4_4_ = fVar219;
      auVar201._0_4_ = fVar219;
      auVar201._8_4_ = fVar219;
      auVar201._12_4_ = fVar219;
      auVar201._16_4_ = fVar219;
      auVar201._20_4_ = fVar219;
      auVar201._24_4_ = fVar219;
      auVar201._28_4_ = fVar219;
      auVar74._8_4_ = 2;
      auVar74._0_8_ = 0x200000002;
      auVar74._12_4_ = 2;
      auVar74._16_4_ = 2;
      auVar74._20_4_ = 2;
      auVar74._24_4_ = 2;
      auVar74._28_4_ = 2;
      auVar68 = vpermps_avx512vl(auVar74,auVar80);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar70 = vpermps_avx512vl(auVar69,auVar80);
      auVar71 = vpermps_avx512vl(auVar74,auVar78);
      auVar72 = vpermps_avx512vl(auVar69,auVar78);
      auVar80 = vpermps_avx2(auVar74,auVar79);
      auVar73 = vpermps_avx512vl(auVar69,auVar79);
      auVar74 = vpermps_avx512vl(auVar74,auVar76);
      auVar75 = vpermps_avx512vl(auVar69,auVar76);
      auVar43 = vfmadd132ps_fma(auVar81,auVar144,_DAT_01faff20);
      auVar81 = vsubps_avx(auVar238,ZEXT1632(auVar43));
      auVar69 = vmulps_avx512vl(auVar62,ZEXT1632(auVar43));
      auVar78 = ZEXT1632(auVar43);
      auVar76 = vmulps_avx512vl(auVar63,auVar78);
      auVar51 = vfmadd231ps_fma(auVar69,auVar81,auVar123);
      auVar56 = vfmadd231ps_fma(auVar76,auVar81,auVar77);
      auVar69 = vmulps_avx512vl(auVar64,auVar78);
      auVar76 = vmulps_avx512vl(auVar65,auVar78);
      auVar62 = vfmadd231ps_avx512vl(auVar69,auVar81,auVar62);
      auVar63 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar63);
      auVar69 = vmulps_avx512vl(auVar66,auVar78);
      auVar123 = ZEXT1632(auVar43);
      auVar67 = vmulps_avx512vl(auVar67,auVar123);
      auVar64 = vfmadd231ps_avx512vl(auVar69,auVar81,auVar64);
      auVar65 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar65);
      fVar214 = auVar43._0_4_;
      fVar215 = auVar43._4_4_;
      auVar69._4_4_ = fVar215 * auVar62._4_4_;
      auVar69._0_4_ = fVar214 * auVar62._0_4_;
      fVar216 = auVar43._8_4_;
      auVar69._8_4_ = fVar216 * auVar62._8_4_;
      fVar217 = auVar43._12_4_;
      auVar69._12_4_ = fVar217 * auVar62._12_4_;
      auVar69._16_4_ = auVar62._16_4_ * 0.0;
      auVar69._20_4_ = auVar62._20_4_ * 0.0;
      auVar69._24_4_ = auVar62._24_4_ * 0.0;
      auVar69._28_4_ = fVar203;
      auVar76._4_4_ = fVar215 * auVar63._4_4_;
      auVar76._0_4_ = fVar214 * auVar63._0_4_;
      auVar76._8_4_ = fVar216 * auVar63._8_4_;
      auVar76._12_4_ = fVar217 * auVar63._12_4_;
      auVar76._16_4_ = auVar63._16_4_ * 0.0;
      auVar76._20_4_ = auVar63._20_4_ * 0.0;
      auVar76._24_4_ = auVar63._24_4_ * 0.0;
      auVar76._28_4_ = auVar77._28_4_;
      auVar51 = vfmadd231ps_fma(auVar69,auVar81,ZEXT1632(auVar51));
      auVar56 = vfmadd231ps_fma(auVar76,auVar81,ZEXT1632(auVar56));
      auVar82._0_4_ = fVar214 * auVar64._0_4_;
      auVar82._4_4_ = fVar215 * auVar64._4_4_;
      auVar82._8_4_ = fVar216 * auVar64._8_4_;
      auVar82._12_4_ = fVar217 * auVar64._12_4_;
      auVar82._16_4_ = auVar64._16_4_ * 0.0;
      auVar82._20_4_ = auVar64._20_4_ * 0.0;
      auVar82._24_4_ = auVar64._24_4_ * 0.0;
      auVar82._28_4_ = 0;
      auVar78._4_4_ = fVar215 * auVar65._4_4_;
      auVar78._0_4_ = fVar214 * auVar65._0_4_;
      auVar78._8_4_ = fVar216 * auVar65._8_4_;
      auVar78._12_4_ = fVar217 * auVar65._12_4_;
      auVar78._16_4_ = auVar65._16_4_ * 0.0;
      auVar78._20_4_ = auVar65._20_4_ * 0.0;
      auVar78._24_4_ = auVar65._24_4_ * 0.0;
      auVar78._28_4_ = auVar64._28_4_;
      auVar40 = vfmadd231ps_fma(auVar82,auVar81,auVar62);
      auVar54 = vfmadd231ps_fma(auVar78,auVar81,auVar63);
      auVar79._28_4_ = auVar63._28_4_;
      auVar79._0_28_ =
           ZEXT1628(CONCAT412(fVar217 * auVar54._12_4_,
                              CONCAT48(fVar216 * auVar54._8_4_,
                                       CONCAT44(fVar215 * auVar54._4_4_,fVar214 * auVar54._0_4_))));
      auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar217 * auVar40._12_4_,
                                                   CONCAT48(fVar216 * auVar40._8_4_,
                                                            CONCAT44(fVar215 * auVar40._4_4_,
                                                                     fVar214 * auVar40._0_4_)))),
                                auVar81,ZEXT1632(auVar51));
      auVar41 = vfmadd231ps_fma(auVar79,auVar81,ZEXT1632(auVar56));
      auVar77 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar51));
      auVar62 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar56));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar77 = vmulps_avx512vl(auVar77,auVar63);
      auVar62 = vmulps_avx512vl(auVar62,auVar63);
      auVar195._0_4_ = fVar219 * auVar77._0_4_;
      auVar195._4_4_ = fVar219 * auVar77._4_4_;
      auVar195._8_4_ = fVar219 * auVar77._8_4_;
      auVar195._12_4_ = fVar219 * auVar77._12_4_;
      auVar195._16_4_ = fVar219 * auVar77._16_4_;
      auVar195._20_4_ = fVar219 * auVar77._20_4_;
      auVar195._24_4_ = fVar219 * auVar77._24_4_;
      auVar195._28_4_ = 0;
      auVar77 = vmulps_avx512vl(auVar201,auVar62);
      auVar56 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
      auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar56));
      auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar56));
      auVar118._0_4_ = auVar195._0_4_ + auVar55._0_4_;
      auVar118._4_4_ = auVar195._4_4_ + auVar55._4_4_;
      auVar118._8_4_ = auVar195._8_4_ + auVar55._8_4_;
      auVar118._12_4_ = auVar195._12_4_ + auVar55._12_4_;
      auVar118._16_4_ = auVar195._16_4_ + 0.0;
      auVar118._20_4_ = auVar195._20_4_ + 0.0;
      auVar118._24_4_ = auVar195._24_4_ + 0.0;
      auVar118._28_4_ = 0;
      auVar82 = ZEXT1632(auVar56);
      auVar65 = vpermt2ps_avx512vl(auVar195,_DAT_01feed00,auVar82);
      auVar66 = vaddps_avx512vl(ZEXT1632(auVar41),auVar77);
      auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar82);
      auVar77 = vsubps_avx(auVar62,auVar65);
      auVar65 = vsubps_avx512vl(auVar64,auVar67);
      auVar67 = vmulps_avx512vl(auVar71,auVar123);
      auVar69 = vmulps_avx512vl(auVar72,auVar123);
      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar68);
      auVar69 = vfmadd231ps_avx512vl(auVar69,auVar81,auVar70);
      auVar76 = vmulps_avx512vl(auVar80,auVar123);
      auVar78 = vmulps_avx512vl(auVar73,auVar123);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar71);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar72);
      auVar79 = vmulps_avx512vl(auVar74,auVar123);
      auVar68 = vmulps_avx512vl(auVar75,auVar123);
      auVar51 = vfmadd231ps_fma(auVar79,auVar81,auVar80);
      auVar80 = vfmadd231ps_avx512vl(auVar68,auVar81,auVar73);
      auVar79 = vmulps_avx512vl(auVar123,auVar76);
      auVar70 = ZEXT1632(auVar43);
      auVar68 = vmulps_avx512vl(auVar70,auVar78);
      auVar67 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar67);
      auVar69 = vfmadd231ps_avx512vl(auVar68,auVar81,auVar69);
      auVar80 = vmulps_avx512vl(auVar70,auVar80);
      auVar76 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar217 * auVar51._12_4_,
                                              CONCAT48(fVar216 * auVar51._8_4_,
                                                       CONCAT44(fVar215 * auVar51._4_4_,
                                                                fVar214 * auVar51._0_4_)))),auVar81,
                           auVar76);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar78);
      auVar68._4_4_ = fVar215 * auVar76._4_4_;
      auVar68._0_4_ = fVar214 * auVar76._0_4_;
      auVar68._8_4_ = fVar216 * auVar76._8_4_;
      auVar68._12_4_ = fVar217 * auVar76._12_4_;
      auVar68._16_4_ = auVar76._16_4_ * 0.0;
      auVar68._20_4_ = auVar76._20_4_ * 0.0;
      auVar68._24_4_ = auVar76._24_4_ * 0.0;
      auVar68._28_4_ = auVar73._28_4_;
      auVar78 = vmulps_avx512vl(auVar70,auVar80);
      auVar79 = vfmadd231ps_avx512vl(auVar68,auVar81,auVar67);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar81);
      auVar81 = vsubps_avx512vl(auVar76,auVar67);
      auVar80 = vsubps_avx512vl(auVar80,auVar69);
      auVar81 = vmulps_avx512vl(auVar81,auVar63);
      auVar80 = vmulps_avx512vl(auVar80,auVar63);
      fVar203 = fVar219 * auVar81._0_4_;
      fVar214 = fVar219 * auVar81._4_4_;
      auVar70._4_4_ = fVar214;
      auVar70._0_4_ = fVar203;
      fVar215 = fVar219 * auVar81._8_4_;
      auVar70._8_4_ = fVar215;
      fVar216 = fVar219 * auVar81._12_4_;
      auVar70._12_4_ = fVar216;
      fVar217 = fVar219 * auVar81._16_4_;
      auVar70._16_4_ = fVar217;
      fVar218 = fVar219 * auVar81._20_4_;
      auVar70._20_4_ = fVar218;
      fVar219 = fVar219 * auVar81._24_4_;
      auVar70._24_4_ = fVar219;
      auVar70._28_4_ = auVar81._28_4_;
      auVar80 = vmulps_avx512vl(auVar201,auVar80);
      auVar63 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar82);
      auVar67 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar82);
      auVar202._0_4_ = auVar79._0_4_ + fVar203;
      auVar202._4_4_ = auVar79._4_4_ + fVar214;
      auVar202._8_4_ = auVar79._8_4_ + fVar215;
      auVar202._12_4_ = auVar79._12_4_ + fVar216;
      auVar202._16_4_ = auVar79._16_4_ + fVar217;
      auVar202._20_4_ = auVar79._20_4_ + fVar218;
      auVar202._24_4_ = auVar79._24_4_ + fVar219;
      auVar202._28_4_ = auVar79._28_4_ + auVar81._28_4_;
      auVar81 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,ZEXT1632(auVar56));
      auVar69 = vaddps_avx512vl(auVar78,auVar80);
      auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,ZEXT1632(auVar56));
      auVar81 = vsubps_avx(auVar63,auVar81);
      auVar80 = vsubps_avx512vl(auVar67,auVar80);
      auVar123 = ZEXT1632(auVar55);
      auVar76 = vsubps_avx512vl(auVar79,auVar123);
      auVar144 = ZEXT1632(auVar41);
      auVar68 = vsubps_avx512vl(auVar78,auVar144);
      auVar70 = vsubps_avx512vl(auVar63,auVar62);
      auVar76 = vaddps_avx512vl(auVar76,auVar70);
      auVar70 = vsubps_avx512vl(auVar67,auVar64);
      auVar68 = vaddps_avx512vl(auVar68,auVar70);
      auVar70 = vmulps_avx512vl(auVar144,auVar76);
      auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar123,auVar68);
      auVar71 = vmulps_avx512vl(auVar66,auVar76);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar118,auVar68);
      auVar72 = vmulps_avx512vl(auVar65,auVar76);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar77,auVar68);
      auVar73 = vmulps_avx512vl(auVar64,auVar76);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar62,auVar68);
      auVar74 = vmulps_avx512vl(auVar78,auVar76);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar68);
      auVar75 = vmulps_avx512vl(auVar69,auVar76);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar202,auVar68);
      auVar82 = vmulps_avx512vl(auVar80,auVar76);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar81,auVar68);
      auVar76 = vmulps_avx512vl(auVar67,auVar76);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar63,auVar68);
      auVar68 = vminps_avx512vl(auVar70,auVar71);
      auVar70 = vmaxps_avx512vl(auVar70,auVar71);
      auVar71 = vminps_avx512vl(auVar72,auVar73);
      auVar68 = vminps_avx512vl(auVar68,auVar71);
      auVar71 = vmaxps_avx512vl(auVar72,auVar73);
      auVar70 = vmaxps_avx512vl(auVar70,auVar71);
      auVar71 = vminps_avx512vl(auVar74,auVar75);
      auVar72 = vmaxps_avx512vl(auVar74,auVar75);
      auVar73 = vminps_avx512vl(auVar82,auVar76);
      auVar71 = vminps_avx512vl(auVar71,auVar73);
      auVar68 = vminps_avx512vl(auVar68,auVar71);
      auVar76 = vmaxps_avx512vl(auVar82,auVar76);
      auVar76 = vmaxps_avx512vl(auVar72,auVar76);
      auVar76 = vmaxps_avx512vl(auVar70,auVar76);
      uVar13 = vcmpps_avx512vl(auVar68,local_78,2);
      auVar71._4_4_ = uStack_94;
      auVar71._0_4_ = local_98;
      auVar71._8_4_ = uStack_90;
      auVar71._12_4_ = uStack_8c;
      auVar71._16_4_ = uStack_88;
      auVar71._20_4_ = uStack_84;
      auVar71._24_4_ = uStack_80;
      auVar71._28_4_ = uStack_7c;
      uVar14 = vcmpps_avx512vl(auVar76,auVar71,5);
      bVar22 = (byte)uVar13 & (byte)uVar14 & 0x7f;
      if (bVar22 == 0) {
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar81._16_16_ = DAT_01feed20._16_16_;
      }
      else {
        auVar76 = vsubps_avx512vl(auVar62,auVar123);
        auVar68 = vsubps_avx512vl(auVar64,auVar144);
        auVar70 = vsubps_avx512vl(auVar63,auVar79);
        auVar76 = vaddps_avx512vl(auVar76,auVar70);
        auVar70 = vsubps_avx512vl(auVar67,auVar78);
        auVar68 = vaddps_avx512vl(auVar68,auVar70);
        auVar70 = vmulps_avx512vl(auVar144,auVar76);
        auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar123);
        auVar66 = vmulps_avx512vl(auVar66,auVar76);
        auVar66 = vfnmadd213ps_avx512vl(auVar118,auVar68,auVar66);
        auVar65 = vmulps_avx512vl(auVar65,auVar76);
        auVar65 = vfnmadd213ps_avx512vl(auVar77,auVar68,auVar65);
        auVar77 = vmulps_avx512vl(auVar64,auVar76);
        auVar64 = vfnmadd231ps_avx512vl(auVar77,auVar68,auVar62);
        auVar77 = vmulps_avx512vl(auVar78,auVar76);
        auVar78 = vfnmadd231ps_avx512vl(auVar77,auVar68,auVar79);
        auVar77 = vmulps_avx512vl(auVar69,auVar76);
        auVar69 = vfnmadd213ps_avx512vl(auVar202,auVar68,auVar77);
        auVar77 = vmulps_avx512vl(auVar80,auVar76);
        auVar79 = vfnmadd213ps_avx512vl(auVar81,auVar68,auVar77);
        auVar81 = vmulps_avx512vl(auVar67,auVar76);
        auVar67 = vfnmadd231ps_avx512vl(auVar81,auVar63,auVar68);
        auVar77 = vminps_avx(auVar70,auVar66);
        auVar81 = vmaxps_avx(auVar70,auVar66);
        auVar62 = vminps_avx(auVar65,auVar64);
        auVar62 = vminps_avx(auVar77,auVar62);
        auVar77 = vmaxps_avx(auVar65,auVar64);
        auVar81 = vmaxps_avx(auVar81,auVar77);
        auVar80 = vminps_avx(auVar78,auVar69);
        auVar77 = vmaxps_avx(auVar78,auVar69);
        auVar63 = vminps_avx(auVar79,auVar67);
        auVar80 = vminps_avx(auVar80,auVar63);
        auVar80 = vminps_avx(auVar62,auVar80);
        auVar62 = vmaxps_avx(auVar79,auVar67);
        auVar77 = vmaxps_avx(auVar77,auVar62);
        auVar81 = vmaxps_avx(auVar81,auVar77);
        uVar13 = vcmpps_avx512vl(auVar81,auVar71,5);
        uVar14 = vcmpps_avx512vl(auVar80,local_78,2);
        bVar22 = bVar22 & (byte)uVar13 & (byte)uVar14;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        if (bVar22 != 0) {
          auStack_178[uVar24] = (uint)bVar22;
          uVar13 = vmovlps_avx(auVar42);
          (&uStack_b8)[uVar24] = uVar13;
          uVar2 = vmovlps_avx(auVar107);
          auStack_58[uVar24] = uVar2;
          uVar24 = (ulong)((int)uVar24 + 1);
        }
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar81._16_16_ = auVar77._16_16_;
      }
      in_ZMM24 = ZEXT3264(_DAT_01feed20);
      auVar248 = ZEXT1664(auVar43);
      auVar247 = ZEXT3264(auVar77);
      auVar246 = ZEXT1664(auVar42);
      if ((int)uVar24 != 0) {
        do {
          auVar43 = auVar250._0_16_;
          auVar51 = auVar252._0_16_;
          uVar23 = (int)uVar24 - 1;
          uVar25 = (ulong)uVar23;
          uVar32 = auStack_178[uVar25];
          auVar107._8_8_ = 0;
          auVar107._0_8_ = auStack_58[uVar25];
          uVar2 = 0;
          for (uVar28 = (ulong)uVar32; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
          {
            uVar2 = uVar2 + 1;
          }
          uVar27 = uVar32 - 1 & uVar32;
          bVar35 = uVar27 == 0;
          auStack_178[uVar25] = uVar27;
          if (bVar35) {
            uVar24 = (ulong)uVar23;
          }
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar2;
          auVar42 = vpunpcklqdq_avx(auVar100,ZEXT416((int)uVar2 + 1));
          auVar42 = vcvtqq2ps_avx512vl(auVar42);
          auVar42 = vmulps_avx512vl(auVar42,auVar248._0_16_);
          uVar95 = *(undefined4 *)((long)&uStack_b8 + uVar25 * 8 + 4);
          auVar16._4_4_ = uVar95;
          auVar16._0_4_ = uVar95;
          auVar16._8_4_ = uVar95;
          auVar16._12_4_ = uVar95;
          auVar56 = vmulps_avx512vl(auVar42,auVar16);
          auVar42 = vsubps_avx512vl(auVar43,auVar42);
          uVar95 = *(undefined4 *)(&uStack_b8 + uVar25);
          auVar17._4_4_ = uVar95;
          auVar17._0_4_ = uVar95;
          auVar17._8_4_ = uVar95;
          auVar17._12_4_ = uVar95;
          auVar42 = vfmadd231ps_avx512vl(auVar56,auVar42,auVar17);
          auVar56 = vmovshdup_avx(auVar42);
          fVar219 = auVar56._0_4_ - auVar42._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar219));
          if (uVar32 == 0 || bVar35) goto LAB_01bc2813;
          auVar56 = vshufps_avx(auVar107,auVar107,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar219));
          uVar23 = (uint)uVar24;
          auVar55 = vsubps_avx512vl(auVar43,auVar56);
          fVar203 = auVar56._0_4_;
          auVar139._0_4_ = fVar203 * (float)local_2b8._0_4_;
          fVar214 = auVar56._4_4_;
          auVar139._4_4_ = fVar214 * (float)local_2b8._4_4_;
          fVar215 = auVar56._8_4_;
          auVar139._8_4_ = fVar215 * fStack_2b0;
          fVar216 = auVar56._12_4_;
          auVar139._12_4_ = fVar216 * fStack_2ac;
          auVar158._0_4_ = fVar203 * (float)local_2c8._0_4_;
          auVar158._4_4_ = fVar214 * (float)local_2c8._4_4_;
          auVar158._8_4_ = fVar215 * fStack_2c0;
          auVar158._12_4_ = fVar216 * fStack_2bc;
          auVar166._0_4_ = fVar203 * (float)local_2d8._0_4_;
          auVar166._4_4_ = fVar214 * (float)local_2d8._4_4_;
          auVar166._8_4_ = fVar215 * fStack_2d0;
          auVar166._12_4_ = fVar216 * fStack_2cc;
          auVar119._0_4_ = fVar203 * (float)local_2e8._0_4_;
          auVar119._4_4_ = fVar214 * (float)local_2e8._4_4_;
          auVar119._8_4_ = fVar215 * fStack_2e0;
          auVar119._12_4_ = fVar216 * fStack_2dc;
          auVar56 = vfmadd231ps_fma(auVar139,auVar55,local_278);
          auVar40 = vfmadd231ps_fma(auVar158,auVar55,local_288);
          auVar54 = vfmadd231ps_fma(auVar166,auVar55,local_298);
          auVar55 = vfmadd231ps_fma(auVar119,auVar55,local_2a8);
          auVar75._16_16_ = auVar56;
          auVar75._0_16_ = auVar56;
          auVar145._16_16_ = auVar40;
          auVar145._0_16_ = auVar40;
          auVar162._16_16_ = auVar54;
          auVar162._0_16_ = auVar54;
          auVar77 = vpermps_avx512vl(in_ZMM24._0_32_,ZEXT1632(auVar42));
          auVar81 = vsubps_avx(auVar145,auVar75);
          auVar40 = vfmadd213ps_fma(auVar81,auVar77,auVar75);
          auVar81 = vsubps_avx(auVar162,auVar145);
          auVar41 = vfmadd213ps_fma(auVar81,auVar77,auVar145);
          auVar56 = vsubps_avx(auVar55,auVar54);
          auVar146._16_16_ = auVar56;
          auVar146._0_16_ = auVar56;
          auVar56 = vfmadd213ps_fma(auVar146,auVar77,auVar162);
          auVar81 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar40));
          auVar40 = vfmadd213ps_fma(auVar81,auVar77,ZEXT1632(auVar40));
          auVar81 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar41));
          auVar56 = vfmadd213ps_fma(auVar81,auVar77,ZEXT1632(auVar41));
          auVar81 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar40));
          auVar44 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar81,auVar77);
          auVar81 = vmulps_avx512vl(auVar81,auVar247._0_32_);
          auVar56 = vmulss_avx512f(ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar203 = auVar56._0_4_;
          auVar167._0_8_ =
               CONCAT44(auVar44._4_4_ + fVar203 * auVar81._4_4_,
                        auVar44._0_4_ + fVar203 * auVar81._0_4_);
          auVar167._8_4_ = auVar44._8_4_ + fVar203 * auVar81._8_4_;
          auVar167._12_4_ = auVar44._12_4_ + fVar203 * auVar81._12_4_;
          auVar140._0_4_ = fVar203 * auVar81._16_4_;
          auVar140._4_4_ = fVar203 * auVar81._20_4_;
          auVar140._8_4_ = fVar203 * auVar81._24_4_;
          auVar140._12_4_ = fVar203 * auVar81._28_4_;
          auVar61 = vsubps_avx((undefined1  [16])0x0,auVar140);
          auVar41 = vshufpd_avx(auVar44,auVar44,3);
          auVar57 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar56 = vsubps_avx(auVar41,auVar44);
          auVar40 = vsubps_avx(auVar57,(undefined1  [16])0x0);
          auVar187._0_4_ = auVar56._0_4_ + auVar40._0_4_;
          auVar187._4_4_ = auVar56._4_4_ + auVar40._4_4_;
          auVar187._8_4_ = auVar56._8_4_ + auVar40._8_4_;
          auVar187._12_4_ = auVar56._12_4_ + auVar40._12_4_;
          auVar56 = vshufps_avx(auVar44,auVar44,0xb1);
          auVar40 = vshufps_avx(auVar167,auVar167,0xb1);
          auVar54 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar236._4_4_ = auVar187._0_4_;
          auVar236._0_4_ = auVar187._0_4_;
          auVar236._8_4_ = auVar187._0_4_;
          auVar236._12_4_ = auVar187._0_4_;
          auVar58 = vshufps_avx(auVar187,auVar187,0x55);
          fVar203 = auVar58._0_4_;
          auVar199._0_4_ = auVar56._0_4_ * fVar203;
          fVar214 = auVar58._4_4_;
          auVar199._4_4_ = auVar56._4_4_ * fVar214;
          fVar215 = auVar58._8_4_;
          auVar199._8_4_ = auVar56._8_4_ * fVar215;
          fVar216 = auVar58._12_4_;
          auVar199._12_4_ = auVar56._12_4_ * fVar216;
          auVar206._0_4_ = auVar40._0_4_ * fVar203;
          auVar206._4_4_ = auVar40._4_4_ * fVar214;
          auVar206._8_4_ = auVar40._8_4_ * fVar215;
          auVar206._12_4_ = auVar40._12_4_ * fVar216;
          auVar220._0_4_ = auVar54._0_4_ * fVar203;
          auVar220._4_4_ = auVar54._4_4_ * fVar214;
          auVar220._8_4_ = auVar54._8_4_ * fVar215;
          auVar220._12_4_ = auVar54._12_4_ * fVar216;
          auVar188._0_4_ = auVar55._0_4_ * fVar203;
          auVar188._4_4_ = auVar55._4_4_ * fVar214;
          auVar188._8_4_ = auVar55._8_4_ * fVar215;
          auVar188._12_4_ = auVar55._12_4_ * fVar216;
          auVar56 = vfmadd231ps_fma(auVar199,auVar236,auVar44);
          auVar40 = vfmadd231ps_fma(auVar206,auVar236,auVar167);
          auVar38 = vfmadd231ps_fma(auVar220,auVar236,auVar61);
          auVar60 = vfmadd231ps_fma(auVar188,(undefined1  [16])0x0,auVar236);
          auVar58 = vshufpd_avx(auVar56,auVar56,1);
          auVar59 = vshufpd_avx(auVar40,auVar40,1);
          auVar45 = vshufpd_avx512vl(auVar38,auVar38,1);
          auVar46 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar54 = vminss_avx(auVar56,auVar40);
          auVar56 = vmaxss_avx(auVar40,auVar56);
          auVar55 = vminss_avx(auVar38,auVar60);
          auVar40 = vmaxss_avx(auVar60,auVar38);
          auVar54 = vminss_avx(auVar54,auVar55);
          auVar56 = vmaxss_avx(auVar40,auVar56);
          auVar55 = vminss_avx(auVar58,auVar59);
          auVar40 = vmaxss_avx(auVar59,auVar58);
          auVar58 = vminss_avx512f(auVar45,auVar46);
          auVar59 = vmaxss_avx512f(auVar46,auVar45);
          auVar40 = vmaxss_avx(auVar59,auVar40);
          auVar55 = vminss_avx512f(auVar55,auVar58);
          vucomiss_avx512f(auVar54);
          fVar214 = auVar40._0_4_;
          fVar203 = auVar56._0_4_;
          if (uVar23 < 5) {
LAB_01bc2fa6:
            auVar58 = vucomiss_avx512f(auVar55);
            bVar36 = fVar214 <= -0.0001;
            bVar34 = -0.0001 < fVar203;
            bVar33 = bVar36;
            if (!bVar36) goto LAB_01bc2fee;
            uVar13 = vcmpps_avx512vl(auVar54,auVar58,5);
            uVar14 = vcmpps_avx512vl(auVar55,auVar58,5);
            bVar22 = (byte)uVar13 & (byte)uVar14 & 1;
            bVar36 = bVar34 && bVar22 == 0;
            bVar33 = bVar34 && bVar22 == 0;
            if (bVar34 && bVar22 == 0) goto LAB_01bc2fee;
          }
          else {
            bVar36 = fVar214 == -0.0001;
            bVar33 = NAN(fVar214);
            if (fVar214 <= -0.0001) goto LAB_01bc2fa6;
LAB_01bc2fee:
            vcmpss_avx512f(auVar54,auVar51,1);
            auVar38 = auVar251._0_16_;
            uVar13 = vcmpss_avx512f(auVar56,auVar51,1);
            bVar34 = (bool)((byte)uVar13 & 1);
            auVar81._0_16_ = auVar38;
            iVar94 = auVar251._0_4_;
            auVar83._4_28_ = auVar81._4_28_;
            auVar83._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar94);
            vucomiss_avx512f(auVar83._0_16_);
            bVar33 = (bool)(!bVar36 | bVar33);
            bVar34 = bVar33 == false;
            auVar85._16_16_ = auVar81._16_16_;
            auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar84._4_28_ = auVar85._4_28_;
            auVar84._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * 0x7f800000;
            auVar59 = auVar84._0_16_;
            auVar87._16_16_ = auVar81._16_16_;
            auVar87._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar86._4_28_ = auVar87._4_28_;
            auVar86._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * -0x800000;
            auVar58 = auVar86._0_16_;
            uVar13 = vcmpss_avx512f(auVar55,auVar51,1);
            bVar36 = (bool)((byte)uVar13 & 1);
            auVar89._16_16_ = auVar81._16_16_;
            auVar89._0_16_ = auVar38;
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar94);
            vucomiss_avx512f(auVar88._0_16_);
            if ((bVar33) || (bVar34)) {
              auVar55 = vucomiss_avx512f(auVar54);
              if ((bVar33) || (bVar34)) {
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar60 = vxorps_avx512vl(auVar54,auVar21);
                auVar54 = vsubss_avx512f(auVar55,auVar54);
                auVar54 = vdivss_avx512f(auVar60,auVar54);
                auVar55 = vsubss_avx512f(auVar38,auVar54);
                auVar54 = vfmadd213ss_avx512f(auVar55,auVar51,auVar54);
                auVar55 = auVar54;
              }
              else {
                auVar55 = vxorps_avx512vl(auVar55,auVar55);
                vucomiss_avx512f(auVar55);
                if ((bVar33) || (auVar54 = auVar38, bVar34)) {
                  auVar54 = SUB6416(ZEXT464(0xff800000),0);
                  auVar55 = ZEXT416(0x7f800000);
                }
              }
              auVar59 = vminss_avx512f(auVar59,auVar55);
              auVar58 = vmaxss_avx(auVar54,auVar58);
            }
            uVar13 = vcmpss_avx512f(auVar40,auVar51,1);
            bVar36 = (bool)((byte)uVar13 & 1);
            fVar215 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar94);
            if ((auVar83._0_4_ != fVar215) || (NAN(auVar83._0_4_) || NAN(fVar215))) {
              if ((fVar214 != fVar203) || (NAN(fVar214) || NAN(fVar203))) {
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar56 = vxorps_avx512vl(auVar56,auVar20);
                auVar189._0_4_ = auVar56._0_4_ / (fVar214 - fVar203);
                auVar189._4_12_ = auVar56._4_12_;
                auVar56 = vsubss_avx512f(auVar38,auVar189);
                auVar56 = vfmadd213ss_avx512f(auVar56,auVar51,auVar189);
                auVar40 = auVar56;
              }
              else if ((fVar203 != 0.0) ||
                      (auVar56 = auVar38, auVar40 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar203))) {
                auVar56 = SUB6416(ZEXT464(0xff800000),0);
                auVar40 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar59 = vminss_avx(auVar59,auVar40);
              auVar58 = vmaxss_avx(auVar56,auVar58);
            }
            bVar36 = auVar88._0_4_ != fVar215;
            auVar56 = vminss_avx512f(auVar59,auVar38);
            auVar91._16_16_ = auVar81._16_16_;
            auVar91._0_16_ = auVar59;
            auVar90._4_28_ = auVar91._4_28_;
            auVar90._0_4_ = (uint)bVar36 * auVar56._0_4_ + (uint)!bVar36 * auVar59._0_4_;
            auVar56 = vmaxss_avx512f(auVar38,auVar58);
            auVar93._16_16_ = auVar81._16_16_;
            auVar93._0_16_ = auVar58;
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (uint)bVar36 * auVar56._0_4_ + (uint)!bVar36 * auVar58._0_4_;
            auVar56 = vmaxss_avx512f(auVar51,auVar90._0_16_);
            auVar40 = vminss_avx512f(auVar92._0_16_,auVar38);
            if (auVar56._0_4_ <= auVar40._0_4_) {
              auVar55 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar56._0_4_ + -0.1)));
              auVar60 = vminss_avx512f(ZEXT416((uint)(auVar40._0_4_ + 0.1)),auVar38);
              auVar120._0_8_ = auVar44._0_8_;
              auVar120._8_8_ = auVar120._0_8_;
              auVar207._8_8_ = auVar167._0_8_;
              auVar207._0_8_ = auVar167._0_8_;
              auVar221._8_8_ = auVar61._0_8_;
              auVar221._0_8_ = auVar61._0_8_;
              auVar56 = vshufpd_avx(auVar167,auVar167,3);
              auVar40 = vshufpd_avx(auVar61,auVar61,3);
              auVar54 = vshufps_avx(auVar55,auVar60,0);
              auVar59 = vsubps_avx512vl(auVar43,auVar54);
              fVar203 = auVar54._0_4_;
              auVar159._0_4_ = fVar203 * auVar41._0_4_;
              fVar214 = auVar54._4_4_;
              auVar159._4_4_ = fVar214 * auVar41._4_4_;
              fVar215 = auVar54._8_4_;
              auVar159._8_4_ = fVar215 * auVar41._8_4_;
              fVar216 = auVar54._12_4_;
              auVar159._12_4_ = fVar216 * auVar41._12_4_;
              auVar168._0_4_ = fVar203 * auVar56._0_4_;
              auVar168._4_4_ = fVar214 * auVar56._4_4_;
              auVar168._8_4_ = fVar215 * auVar56._8_4_;
              auVar168._12_4_ = fVar216 * auVar56._12_4_;
              auVar241._0_4_ = auVar40._0_4_ * fVar203;
              auVar241._4_4_ = auVar40._4_4_ * fVar214;
              auVar241._8_4_ = auVar40._8_4_ * fVar215;
              auVar241._12_4_ = auVar40._12_4_ * fVar216;
              auVar141._0_4_ = fVar203 * auVar57._0_4_;
              auVar141._4_4_ = fVar214 * auVar57._4_4_;
              auVar141._8_4_ = fVar215 * auVar57._8_4_;
              auVar141._12_4_ = fVar216 * auVar57._12_4_;
              auVar41 = vfmadd231ps_fma(auVar159,auVar59,auVar120);
              auVar57 = vfmadd231ps_fma(auVar168,auVar59,auVar207);
              auVar58 = vfmadd231ps_fma(auVar241,auVar59,auVar221);
              auVar59 = vfmadd231ps_fma(auVar141,auVar59,ZEXT816(0));
              auVar40 = vsubss_avx512f(auVar38,auVar55);
              auVar56 = vmovshdup_avx(auVar107);
              auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar55._0_4_)),auVar107,
                                        auVar40);
              auVar40 = vsubss_avx512f(auVar38,auVar60);
              auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * auVar60._0_4_)),auVar107,
                                        auVar40);
              auVar61 = vdivss_avx512f(auVar38,ZEXT416((uint)fVar219));
              auVar56 = vsubps_avx(auVar57,auVar41);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar54 = vmulps_avx512vl(auVar56,auVar60);
              auVar56 = vsubps_avx(auVar58,auVar57);
              auVar55 = vmulps_avx512vl(auVar56,auVar60);
              auVar56 = vsubps_avx(auVar59,auVar58);
              auVar56 = vmulps_avx512vl(auVar56,auVar60);
              auVar40 = vminps_avx(auVar55,auVar56);
              auVar56 = vmaxps_avx(auVar55,auVar56);
              auVar40 = vminps_avx(auVar54,auVar40);
              auVar56 = vmaxps_avx(auVar54,auVar56);
              auVar54 = vshufpd_avx(auVar40,auVar40,3);
              auVar55 = vshufpd_avx(auVar56,auVar56,3);
              auVar40 = vminps_avx(auVar40,auVar54);
              auVar56 = vmaxps_avx(auVar56,auVar55);
              fVar219 = auVar61._0_4_;
              auVar190._0_4_ = auVar40._0_4_ * fVar219;
              auVar190._4_4_ = auVar40._4_4_ * fVar219;
              auVar190._8_4_ = auVar40._8_4_ * fVar219;
              auVar190._12_4_ = auVar40._12_4_ * fVar219;
              auVar180._0_4_ = fVar219 * auVar56._0_4_;
              auVar180._4_4_ = fVar219 * auVar56._4_4_;
              auVar180._8_4_ = fVar219 * auVar56._8_4_;
              auVar180._12_4_ = fVar219 * auVar56._12_4_;
              auVar61 = vdivss_avx512f(auVar38,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
              auVar56 = vshufpd_avx(auVar41,auVar41,3);
              auVar40 = vshufpd_avx(auVar57,auVar57,3);
              auVar54 = vshufpd_avx(auVar58,auVar58,3);
              auVar55 = vshufpd_avx(auVar59,auVar59,3);
              auVar56 = vsubps_avx(auVar56,auVar41);
              auVar41 = vsubps_avx(auVar40,auVar57);
              auVar57 = vsubps_avx(auVar54,auVar58);
              auVar55 = vsubps_avx(auVar55,auVar59);
              auVar40 = vminps_avx(auVar56,auVar41);
              auVar56 = vmaxps_avx(auVar56,auVar41);
              auVar54 = vminps_avx(auVar57,auVar55);
              auVar54 = vminps_avx(auVar40,auVar54);
              auVar40 = vmaxps_avx(auVar57,auVar55);
              auVar56 = vmaxps_avx(auVar56,auVar40);
              fVar219 = auVar61._0_4_;
              auVar222._0_4_ = fVar219 * auVar54._0_4_;
              auVar222._4_4_ = fVar219 * auVar54._4_4_;
              auVar222._8_4_ = fVar219 * auVar54._8_4_;
              auVar222._12_4_ = fVar219 * auVar54._12_4_;
              auVar208._0_4_ = fVar219 * auVar56._0_4_;
              auVar208._4_4_ = fVar219 * auVar56._4_4_;
              auVar208._8_4_ = fVar219 * auVar56._8_4_;
              auVar208._12_4_ = fVar219 * auVar56._12_4_;
              auVar55 = vinsertps_avx(auVar42,auVar45,0x10);
              auVar47 = vpermt2ps_avx512vl(auVar42,_DAT_01feecd0,auVar46);
              auVar108._0_4_ = auVar55._0_4_ + auVar47._0_4_;
              auVar108._4_4_ = auVar55._4_4_ + auVar47._4_4_;
              auVar108._8_4_ = auVar55._8_4_ + auVar47._8_4_;
              auVar108._12_4_ = auVar55._12_4_ + auVar47._12_4_;
              auVar61 = vmulps_avx512vl(auVar108,auVar246._0_16_);
              auVar40 = vshufps_avx(auVar61,auVar61,0x54);
              uVar95 = auVar61._0_4_;
              auVar114._4_4_ = uVar95;
              auVar114._0_4_ = uVar95;
              auVar114._8_4_ = uVar95;
              auVar114._12_4_ = uVar95;
              auVar57 = vfmadd213ps_avx512vl(local_c8,auVar114,auVar39);
              auVar54 = vfmadd213ps_fma(local_d8,auVar114,local_308);
              auVar41 = vfmadd213ps_fma(local_e8,auVar114,_local_318);
              auVar56 = vsubps_avx(auVar54,auVar57);
              auVar57 = vfmadd213ps_fma(auVar56,auVar114,auVar57);
              auVar56 = vsubps_avx(auVar41,auVar54);
              auVar56 = vfmadd213ps_fma(auVar56,auVar114,auVar54);
              auVar56 = vsubps_avx(auVar56,auVar57);
              auVar54 = vfmadd231ps_fma(auVar57,auVar56,auVar114);
              auVar58 = vmulps_avx512vl(auVar56,auVar60);
              auVar229._8_8_ = auVar54._0_8_;
              auVar229._0_8_ = auVar54._0_8_;
              auVar56 = vshufpd_avx(auVar54,auVar54,3);
              auVar54 = vshufps_avx(auVar61,auVar61,0x55);
              auVar41 = vsubps_avx(auVar56,auVar229);
              auVar57 = vfmadd231ps_fma(auVar229,auVar54,auVar41);
              auVar242._8_8_ = auVar58._0_8_;
              auVar242._0_8_ = auVar58._0_8_;
              auVar56 = vshufpd_avx(auVar58,auVar58,3);
              auVar56 = vsubps_avx512vl(auVar56,auVar242);
              auVar56 = vfmadd213ps_avx512vl(auVar56,auVar54,auVar242);
              auVar115._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
              auVar115._8_4_ = auVar41._8_4_ ^ 0x80000000;
              auVar115._12_4_ = auVar41._12_4_ ^ 0x80000000;
              auVar54 = vmovshdup_avx512vl(auVar56);
              auVar243._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar54._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar54._12_4_ ^ 0x80000000;
              auVar58 = vmovshdup_avx512vl(auVar41);
              auVar59 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar41);
              auVar54 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar41._0_4_)),auVar56,
                                            auVar58);
              auVar41 = vpermt2ps_avx512vl(auVar56,SUB6416(ZEXT464(4),0),auVar115);
              auVar142._0_4_ = auVar54._0_4_;
              auVar142._4_4_ = auVar142._0_4_;
              auVar142._8_4_ = auVar142._0_4_;
              auVar142._12_4_ = auVar142._0_4_;
              auVar56 = vdivps_avx(auVar59,auVar142);
              auVar48 = vdivps_avx512vl(auVar41,auVar142);
              fVar219 = auVar57._0_4_;
              auVar54 = vshufps_avx(auVar57,auVar57,0x55);
              auVar230._0_4_ = fVar219 * auVar56._0_4_ + auVar54._0_4_ * auVar48._0_4_;
              auVar230._4_4_ = fVar219 * auVar56._4_4_ + auVar54._4_4_ * auVar48._4_4_;
              auVar230._8_4_ = fVar219 * auVar56._8_4_ + auVar54._8_4_ * auVar48._8_4_;
              auVar230._12_4_ = fVar219 * auVar56._12_4_ + auVar54._12_4_ * auVar48._12_4_;
              auVar60 = vsubps_avx(auVar40,auVar230);
              auVar54 = vmovshdup_avx(auVar56);
              auVar40 = vinsertps_avx(auVar190,auVar222,0x1c);
              auVar244._0_4_ = auVar54._0_4_ * auVar40._0_4_;
              auVar244._4_4_ = auVar54._4_4_ * auVar40._4_4_;
              auVar244._8_4_ = auVar54._8_4_ * auVar40._8_4_;
              auVar244._12_4_ = auVar54._12_4_ * auVar40._12_4_;
              auVar44 = vinsertps_avx512f(auVar180,auVar208,0x1c);
              auVar54 = vmulps_avx512vl(auVar54,auVar44);
              auVar59 = vminps_avx512vl(auVar244,auVar54);
              auVar57 = vmaxps_avx(auVar54,auVar244);
              auVar58 = vmovshdup_avx(auVar48);
              auVar54 = vinsertps_avx(auVar222,auVar190,0x4c);
              auVar223._0_4_ = auVar58._0_4_ * auVar54._0_4_;
              auVar223._4_4_ = auVar58._4_4_ * auVar54._4_4_;
              auVar223._8_4_ = auVar58._8_4_ * auVar54._8_4_;
              auVar223._12_4_ = auVar58._12_4_ * auVar54._12_4_;
              auVar41 = vinsertps_avx(auVar208,auVar180,0x4c);
              auVar209._0_4_ = auVar58._0_4_ * auVar41._0_4_;
              auVar209._4_4_ = auVar58._4_4_ * auVar41._4_4_;
              auVar209._8_4_ = auVar58._8_4_ * auVar41._8_4_;
              auVar209._12_4_ = auVar58._12_4_ * auVar41._12_4_;
              auVar58 = vminps_avx(auVar223,auVar209);
              auVar59 = vaddps_avx512vl(auVar59,auVar58);
              auVar58 = vmaxps_avx(auVar209,auVar223);
              auVar210._0_4_ = auVar57._0_4_ + auVar58._0_4_;
              auVar210._4_4_ = auVar57._4_4_ + auVar58._4_4_;
              auVar210._8_4_ = auVar57._8_4_ + auVar58._8_4_;
              auVar210._12_4_ = auVar57._12_4_ + auVar58._12_4_;
              auVar224._8_8_ = 0x3f80000000000000;
              auVar224._0_8_ = 0x3f80000000000000;
              auVar57 = vsubps_avx(auVar224,auVar210);
              auVar58 = vsubps_avx(auVar224,auVar59);
              auVar59 = vsubps_avx(auVar55,auVar61);
              auVar61 = vsubps_avx(auVar47,auVar61);
              fVar216 = auVar59._0_4_;
              auVar245._0_4_ = fVar216 * auVar57._0_4_;
              fVar217 = auVar59._4_4_;
              auVar245._4_4_ = fVar217 * auVar57._4_4_;
              fVar218 = auVar59._8_4_;
              auVar245._8_4_ = fVar218 * auVar57._8_4_;
              fVar163 = auVar59._12_4_;
              auVar245._12_4_ = fVar163 * auVar57._12_4_;
              auVar49 = vbroadcastss_avx512vl(auVar56);
              auVar40 = vmulps_avx512vl(auVar49,auVar40);
              auVar44 = vmulps_avx512vl(auVar49,auVar44);
              auVar49 = vminps_avx512vl(auVar40,auVar44);
              auVar44 = vmaxps_avx512vl(auVar44,auVar40);
              auVar40 = vbroadcastss_avx512vl(auVar48);
              auVar54 = vmulps_avx512vl(auVar40,auVar54);
              auVar40 = vmulps_avx512vl(auVar40,auVar41);
              auVar41 = vminps_avx512vl(auVar54,auVar40);
              auVar41 = vaddps_avx512vl(auVar49,auVar41);
              auVar59 = vmulps_avx512vl(auVar59,auVar58);
              fVar219 = auVar61._0_4_;
              auVar211._0_4_ = fVar219 * auVar57._0_4_;
              fVar203 = auVar61._4_4_;
              auVar211._4_4_ = fVar203 * auVar57._4_4_;
              fVar214 = auVar61._8_4_;
              auVar211._8_4_ = fVar214 * auVar57._8_4_;
              fVar215 = auVar61._12_4_;
              auVar211._12_4_ = fVar215 * auVar57._12_4_;
              auVar225._0_4_ = fVar219 * auVar58._0_4_;
              auVar225._4_4_ = fVar203 * auVar58._4_4_;
              auVar225._8_4_ = fVar214 * auVar58._8_4_;
              auVar225._12_4_ = fVar215 * auVar58._12_4_;
              auVar40 = vmaxps_avx(auVar40,auVar54);
              auVar181._0_4_ = auVar44._0_4_ + auVar40._0_4_;
              auVar181._4_4_ = auVar44._4_4_ + auVar40._4_4_;
              auVar181._8_4_ = auVar44._8_4_ + auVar40._8_4_;
              auVar181._12_4_ = auVar44._12_4_ + auVar40._12_4_;
              auVar191._8_8_ = 0x3f800000;
              auVar191._0_8_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar191,auVar181);
              auVar54 = vsubps_avx512vl(auVar191,auVar41);
              auVar237._0_4_ = fVar216 * auVar40._0_4_;
              auVar237._4_4_ = fVar217 * auVar40._4_4_;
              auVar237._8_4_ = fVar218 * auVar40._8_4_;
              auVar237._12_4_ = fVar163 * auVar40._12_4_;
              auVar231._0_4_ = fVar216 * auVar54._0_4_;
              auVar231._4_4_ = fVar217 * auVar54._4_4_;
              auVar231._8_4_ = fVar218 * auVar54._8_4_;
              auVar231._12_4_ = fVar163 * auVar54._12_4_;
              auVar182._0_4_ = fVar219 * auVar40._0_4_;
              auVar182._4_4_ = fVar203 * auVar40._4_4_;
              auVar182._8_4_ = fVar214 * auVar40._8_4_;
              auVar182._12_4_ = fVar215 * auVar40._12_4_;
              auVar192._0_4_ = fVar219 * auVar54._0_4_;
              auVar192._4_4_ = fVar203 * auVar54._4_4_;
              auVar192._8_4_ = fVar214 * auVar54._8_4_;
              auVar192._12_4_ = fVar215 * auVar54._12_4_;
              auVar40 = vminps_avx(auVar237,auVar231);
              auVar54 = vminps_avx512vl(auVar182,auVar192);
              auVar41 = vminps_avx512vl(auVar40,auVar54);
              auVar40 = vmaxps_avx(auVar231,auVar237);
              auVar54 = vmaxps_avx(auVar192,auVar182);
              auVar54 = vmaxps_avx(auVar54,auVar40);
              auVar57 = vminps_avx512vl(auVar245,auVar59);
              auVar40 = vminps_avx(auVar211,auVar225);
              auVar40 = vminps_avx(auVar57,auVar40);
              auVar40 = vhaddps_avx(auVar41,auVar40);
              auVar57 = vmaxps_avx512vl(auVar59,auVar245);
              auVar41 = vmaxps_avx(auVar225,auVar211);
              auVar41 = vmaxps_avx(auVar41,auVar57);
              auVar54 = vhaddps_avx(auVar54,auVar41);
              auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
              auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
              auVar183._0_4_ = auVar40._0_4_ + auVar60._0_4_;
              auVar183._4_4_ = auVar40._4_4_ + auVar60._4_4_;
              auVar183._8_4_ = auVar40._8_4_ + auVar60._8_4_;
              auVar183._12_4_ = auVar40._12_4_ + auVar60._12_4_;
              auVar193._0_4_ = auVar54._0_4_ + auVar60._0_4_;
              auVar193._4_4_ = auVar54._4_4_ + auVar60._4_4_;
              auVar193._8_4_ = auVar54._8_4_ + auVar60._8_4_;
              auVar193._12_4_ = auVar54._12_4_ + auVar60._12_4_;
              auVar40 = vmaxps_avx(auVar55,auVar183);
              auVar54 = vminps_avx(auVar193,auVar47);
              uVar2 = vcmpps_avx512vl(auVar54,auVar40,1);
              if ((uVar2 & 3) == 0) {
                uVar2 = vcmpps_avx512vl(auVar193,auVar47,1);
                uVar13 = vcmpps_avx512vl(auVar42,auVar183,1);
                if (((ushort)uVar13 & (ushort)uVar2 & 1) == 0) {
                  bVar22 = 0;
                }
                else {
                  auVar40 = vmovshdup_avx(auVar183);
                  bVar22 = auVar45._0_4_ < auVar40._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
                }
                if (((3 < uVar23 || uVar32 != 0 && !bVar35) | bVar22) != 1) {
                  auVar107 = vinsertps_avx(auVar45,auVar46,0x10);
                  goto LAB_01bc2813;
                }
                lVar26 = 200;
                do {
                  auVar42 = vsubss_avx512f(auVar38,auVar60);
                  fVar214 = auVar42._0_4_;
                  fVar219 = fVar214 * fVar214 * fVar214;
                  fVar215 = auVar60._0_4_;
                  fVar203 = fVar215 * 3.0 * fVar214 * fVar214;
                  fVar214 = fVar214 * fVar215 * fVar215 * 3.0;
                  auVar129._4_4_ = fVar219;
                  auVar129._0_4_ = fVar219;
                  auVar129._8_4_ = fVar219;
                  auVar129._12_4_ = fVar219;
                  auVar121._4_4_ = fVar203;
                  auVar121._0_4_ = fVar203;
                  auVar121._8_4_ = fVar203;
                  auVar121._12_4_ = fVar203;
                  auVar101._4_4_ = fVar214;
                  auVar101._0_4_ = fVar214;
                  auVar101._8_4_ = fVar214;
                  auVar101._12_4_ = fVar214;
                  fVar215 = fVar215 * fVar215 * fVar215;
                  auVar160._0_4_ = (float)local_188._0_4_ * fVar215;
                  auVar160._4_4_ = (float)local_188._4_4_ * fVar215;
                  auVar160._8_4_ = fStack_180 * fVar215;
                  auVar160._12_4_ = fStack_17c * fVar215;
                  auVar42 = vfmadd231ps_fma(auVar160,_local_318,auVar101);
                  auVar42 = vfmadd231ps_fma(auVar42,local_308,auVar121);
                  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar129);
                  auVar102._8_8_ = auVar42._0_8_;
                  auVar102._0_8_ = auVar42._0_8_;
                  auVar42 = vshufpd_avx(auVar42,auVar42,3);
                  auVar40 = vshufps_avx(auVar60,auVar60,0x55);
                  auVar42 = vsubps_avx(auVar42,auVar102);
                  auVar40 = vfmadd213ps_fma(auVar42,auVar40,auVar102);
                  fVar219 = auVar40._0_4_;
                  auVar42 = vshufps_avx(auVar40,auVar40,0x55);
                  auVar103._0_4_ = auVar56._0_4_ * fVar219 + auVar48._0_4_ * auVar42._0_4_;
                  auVar103._4_4_ = auVar56._4_4_ * fVar219 + auVar48._4_4_ * auVar42._4_4_;
                  auVar103._8_4_ = auVar56._8_4_ * fVar219 + auVar48._8_4_ * auVar42._8_4_;
                  auVar103._12_4_ = auVar56._12_4_ * fVar219 + auVar48._12_4_ * auVar42._12_4_;
                  auVar60 = vsubps_avx(auVar60,auVar103);
                  auVar42 = vandps_avx512vl(auVar40,auVar249._0_16_);
                  auVar40 = vprolq_avx512vl(auVar42,0x20);
                  auVar42 = vmaxss_avx(auVar40,auVar42);
                  bVar35 = auVar42._0_4_ <= (float)local_198._0_4_;
                  if (auVar42._0_4_ < (float)local_198._0_4_) {
                    auVar42 = vucomiss_avx512f(auVar51);
                    if (bVar35) {
                      auVar56 = vucomiss_avx512f(auVar42);
                      auVar251 = ZEXT1664(auVar56);
                      if (bVar35) {
                        vmovshdup_avx(auVar42);
                        auVar56 = vucomiss_avx512f(auVar51);
                        if (bVar35) {
                          auVar40 = vucomiss_avx512f(auVar56);
                          auVar251 = ZEXT1664(auVar40);
                          if (bVar35) {
                            auVar54 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar38 = vinsertps_avx(auVar54,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar3 = (ray->org).field_0;
                            auVar54 = vsubps_avx(local_1a8,(undefined1  [16])aVar3);
                            auVar54 = vdpps_avx(auVar54,auVar38,0x7f);
                            auVar55 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
                            auVar55 = vdpps_avx(auVar55,auVar38,0x7f);
                            auVar41 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
                            auVar41 = vdpps_avx(auVar41,auVar38,0x7f);
                            auVar57 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
                            auVar57 = vdpps_avx(auVar57,auVar38,0x7f);
                            auVar58 = vsubps_avx(_local_1e8,(undefined1  [16])aVar3);
                            auVar58 = vdpps_avx(auVar58,auVar38,0x7f);
                            auVar59 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
                            auVar59 = vdpps_avx(auVar59,auVar38,0x7f);
                            auVar61 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
                            auVar61 = vdpps_avx(auVar61,auVar38,0x7f);
                            auVar60 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
                            auVar38 = vdpps_avx(auVar60,auVar38,0x7f);
                            auVar60 = vsubss_avx512f(auVar40,auVar56);
                            fVar219 = auVar56._0_4_;
                            auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar219)),
                                                      auVar60,auVar54);
                            auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar219)),
                                                      auVar60,auVar55);
                            auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar219)),
                                                      auVar60,auVar41);
                            auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar38._0_4_)),
                                                      auVar60,auVar57);
                            auVar40 = vsubss_avx512f(auVar40,auVar42);
                            auVar161._0_4_ = auVar40._0_4_;
                            fVar219 = auVar161._0_4_ * auVar161._0_4_ * auVar161._0_4_;
                            fVar216 = auVar42._0_4_;
                            fVar203 = fVar216 * 3.0 * auVar161._0_4_ * auVar161._0_4_;
                            fVar214 = auVar161._0_4_ * fVar216 * fVar216 * 3.0;
                            fVar217 = fVar216 * fVar216 * fVar216;
                            auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar41._0_4_)),
                                                      ZEXT416((uint)fVar214),auVar55);
                            auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar203),auVar54);
                            auVar56 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar219),auVar56);
                            fVar215 = auVar56._0_4_;
                            if (((ray->org).field_0.m128[3] <= fVar215) &&
                               (fVar218 = ray->tfar, fVar215 <= fVar218)) {
                              auVar56 = vshufps_avx(auVar42,auVar42,0x55);
                              auVar54 = vsubps_avx512vl(auVar43,auVar56);
                              fVar163 = auVar56._0_4_;
                              auVar194._0_4_ = fVar163 * (float)local_1e8._0_4_;
                              fVar172 = auVar56._4_4_;
                              auVar194._4_4_ = fVar172 * (float)local_1e8._4_4_;
                              fVar173 = auVar56._8_4_;
                              auVar194._8_4_ = fVar173 * fStack_1e0;
                              fVar174 = auVar56._12_4_;
                              auVar194._12_4_ = fVar174 * fStack_1dc;
                              auVar200._0_4_ = fVar163 * (float)local_1f8._0_4_;
                              auVar200._4_4_ = fVar172 * (float)local_1f8._4_4_;
                              auVar200._8_4_ = fVar173 * fStack_1f0;
                              auVar200._12_4_ = fVar174 * fStack_1ec;
                              auVar212._0_4_ = fVar163 * (float)local_208._0_4_;
                              auVar212._4_4_ = fVar172 * (float)local_208._4_4_;
                              auVar212._8_4_ = fVar173 * fStack_200;
                              auVar212._12_4_ = fVar174 * fStack_1fc;
                              auVar169._0_4_ = fVar163 * (float)local_218._0_4_;
                              auVar169._4_4_ = fVar172 * (float)local_218._4_4_;
                              auVar169._8_4_ = fVar173 * fStack_210;
                              auVar169._12_4_ = fVar174 * fStack_20c;
                              auVar43 = vfmadd231ps_fma(auVar194,auVar54,local_1a8);
                              auVar56 = vfmadd231ps_fma(auVar200,auVar54,local_1b8);
                              auVar40 = vfmadd231ps_fma(auVar212,auVar54,local_1c8);
                              auVar54 = vfmadd231ps_fma(auVar169,auVar54,local_1d8);
                              auVar43 = vsubps_avx(auVar56,auVar43);
                              auVar56 = vsubps_avx(auVar40,auVar56);
                              auVar40 = vsubps_avx(auVar54,auVar40);
                              auVar213._0_4_ = fVar216 * auVar56._0_4_;
                              auVar213._4_4_ = fVar216 * auVar56._4_4_;
                              auVar213._8_4_ = fVar216 * auVar56._8_4_;
                              auVar213._12_4_ = fVar216 * auVar56._12_4_;
                              auVar161._4_4_ = auVar161._0_4_;
                              auVar161._8_4_ = auVar161._0_4_;
                              auVar161._12_4_ = auVar161._0_4_;
                              auVar43 = vfmadd231ps_fma(auVar213,auVar161,auVar43);
                              auVar170._0_4_ = fVar216 * auVar40._0_4_;
                              auVar170._4_4_ = fVar216 * auVar40._4_4_;
                              auVar170._8_4_ = fVar216 * auVar40._8_4_;
                              auVar170._12_4_ = fVar216 * auVar40._12_4_;
                              auVar56 = vfmadd231ps_fma(auVar170,auVar161,auVar56);
                              auVar171._0_4_ = fVar216 * auVar56._0_4_;
                              auVar171._4_4_ = fVar216 * auVar56._4_4_;
                              auVar171._8_4_ = fVar216 * auVar56._8_4_;
                              auVar171._12_4_ = fVar216 * auVar56._12_4_;
                              auVar43 = vfmadd231ps_fma(auVar171,auVar161,auVar43);
                              auVar19._8_4_ = 0x40400000;
                              auVar19._0_8_ = 0x4040000040400000;
                              auVar19._12_4_ = 0x40400000;
                              auVar43 = vmulps_avx512vl(auVar43,auVar19);
                              pGVar7 = (context->scene->geometries).items[local_2f0].ptr;
                              if ((pGVar7->mask & ray->mask) == 0) {
LAB_01bc3b5c:
                                bVar22 = 0;
                              }
                              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                      (bVar22 = 1,
                                      pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar143._0_4_ = fVar217 * (float)local_138._0_4_;
                                auVar143._4_4_ = fVar217 * (float)local_138._4_4_;
                                auVar143._8_4_ = fVar217 * fStack_130;
                                auVar143._12_4_ = fVar217 * fStack_12c;
                                auVar130._4_4_ = fVar214;
                                auVar130._0_4_ = fVar214;
                                auVar130._8_4_ = fVar214;
                                auVar130._12_4_ = fVar214;
                                auVar56 = vfmadd132ps_fma(auVar130,auVar143,local_128);
                                auVar122._4_4_ = fVar203;
                                auVar122._0_4_ = fVar203;
                                auVar122._8_4_ = fVar203;
                                auVar122._12_4_ = fVar203;
                                auVar56 = vfmadd132ps_fma(auVar122,auVar56,local_118);
                                auVar116._4_4_ = fVar219;
                                auVar116._0_4_ = fVar219;
                                auVar116._8_4_ = fVar219;
                                auVar116._12_4_ = fVar219;
                                auVar54 = vfmadd132ps_fma(auVar116,auVar56,local_108);
                                auVar56 = vshufps_avx(auVar54,auVar54,0xc9);
                                auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
                                auVar117._0_4_ = auVar54._0_4_ * auVar40._0_4_;
                                auVar117._4_4_ = auVar54._4_4_ * auVar40._4_4_;
                                auVar117._8_4_ = auVar54._8_4_ * auVar40._8_4_;
                                auVar117._12_4_ = auVar54._12_4_ * auVar40._12_4_;
                                auVar56 = vfmsub231ps_fma(auVar117,auVar43,auVar56);
                                auVar43 = vshufps_avx(auVar56,auVar56,0xe9);
                                local_168 = vmovlps_avx(auVar43);
                                local_160 = auVar56._0_4_;
                                local_15c = vmovlps_avx(auVar42);
                                local_154 = (int)local_258;
                                local_150 = (int)local_2f0;
                                local_14c = context->user->instID[0];
                                local_148 = context->user->instPrimID[0];
                                ray->tfar = fVar215;
                                local_31c = -1;
                                local_248.valid = &local_31c;
                                local_248.geometryUserPtr = pGVar7->userPtr;
                                local_248.context = context->user;
                                local_248.hit = (RTCHitN *)&local_168;
                                local_248.N = 1;
                                local_248.ray = (RTCRayN *)ray;
                                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  local_260 = lVar31;
                                  (*pGVar7->occlusionFilterN)(&local_248);
                                  in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                  auVar248 = ZEXT1664(auVar42);
                                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar247 = ZEXT3264(auVar81);
                                  auVar251 = ZEXT464(0x3f800000);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar246 = ZEXT1664(auVar42);
                                  auVar42 = vxorps_avx512vl(auVar51,auVar51);
                                  auVar252 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar250 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT1664(auVar42);
                                  lVar31 = local_260;
                                  if (*local_248.valid != 0) goto LAB_01bc3a77;
LAB_01bc3b50:
                                  auVar251 = ZEXT464(0x3f800000);
                                  ray->tfar = fVar218;
                                  goto LAB_01bc3b5c;
                                }
LAB_01bc3a77:
                                auVar42 = auVar252._0_16_;
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_248);
                                  in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                  auVar248 = ZEXT1664(auVar43);
                                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar247 = ZEXT3264(auVar81);
                                  auVar251 = ZEXT464(0x3f800000);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar246 = ZEXT1664(auVar43);
                                  auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                  auVar252 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar250 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT1664(auVar42);
                                  if (*local_248.valid == 0) goto LAB_01bc3b50;
                                }
                                bVar22 = 1;
                              }
                              bVar30 = (bool)(bVar30 | bVar22);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
            }
          }
          if (uVar23 == 0) break;
        } while( true );
      }
      if (bVar30) {
        return bVar30;
      }
      fVar219 = ray->tfar;
      auVar18._4_4_ = fVar219;
      auVar18._0_4_ = fVar219;
      auVar18._8_4_ = fVar219;
      auVar18._12_4_ = fVar219;
      uVar13 = vcmpps_avx512vl(local_f8,auVar18,2);
      uVar32 = (uint)uVar37 & (uint)lVar31 & (uint)uVar13;
      uVar37 = (ulong)uVar32;
    } while (uVar32 != 0);
  }
  return bVar30;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }